

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::SubdivPatch1IntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  GridSOA *pGVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar13;
  undefined4 uVar14;
  long lVar15;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar16;
  undefined4 uVar20;
  RTCRayN *pRVar17;
  ulong uVar18;
  RTCFilterFunctionN p_Var19;
  int iVar21;
  ulong uVar22;
  char *pcVar23;
  uint uVar24;
  undefined4 uVar25;
  GridSOA *pGVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  char *pcVar30;
  Geometry *pGVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar50;
  undefined1 auVar51 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar52;
  float fVar53;
  float fVar72;
  float fVar74;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar75;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar73;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar76;
  float fVar96;
  float fVar97;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar98;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar120;
  float fVar122;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar119 [16];
  float fVar128;
  float fVar137;
  float fVar138;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar139;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  uint uVar140;
  float fVar145;
  float fVar147;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  uint uVar146;
  uint uVar148;
  uint uVar149;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar179;
  float fVar180;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar202 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined8 local_12c8;
  float old_t_1;
  undefined4 uStack_12b4;
  undefined4 uStack_12b0;
  undefined4 uStack_12ac;
  float old_t;
  undefined4 uStack_12a4;
  undefined4 uStack_12a0;
  undefined4 uStack_129c;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1278;
  undefined4 uStack_125c;
  vbool<4> valid;
  undefined1 local_1238 [16];
  Precalculations *local_1228;
  char *local_1220;
  ulong local_1218;
  GridSOA *local_1210;
  undefined8 local_1208;
  float fStack_1200;
  float fStack_11fc;
  undefined8 local_11f8;
  float fStack_11f0;
  float fStack_11ec;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  float local_1158 [4];
  float local_1148 [4];
  float local_1138 [4];
  undefined1 local_1128 [8];
  float fStack_1120;
  float fStack_111c;
  float local_1118 [4];
  float local_1108 [4];
  undefined1 local_10f8 [16];
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [8];
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined1 local_1058 [16];
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  uint local_1028;
  uint uStack_1024;
  uint uStack_1020;
  uint uStack_101c;
  uint local_1018;
  uint uStack_1014;
  uint uStack_1010;
  uint uStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar16 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar137 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar147 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar164 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar161 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar172 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar193 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar150 = fVar161 * 0.99999964;
  fVar154 = fVar172 * 0.99999964;
  fVar200 = fVar193 * 0.99999964;
  fVar161 = fVar161 * 1.0000004;
  fVar172 = fVar172 * 1.0000004;
  fVar193 = fVar193 * 1.0000004;
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar21 = (tray->tnear).field_0.i[k];
  auVar174._4_4_ = iVar21;
  auVar174._0_4_ = iVar21;
  auVar174._8_4_ = iVar21;
  auVar174._12_4_ = iVar21;
  iVar21 = (tray->tfar).field_0.i[k];
  auVar175._4_4_ = iVar21;
  auVar175._0_4_ = iVar21;
  auVar175._8_4_ = iVar21;
  auVar175._12_4_ = iVar21;
  lVar15 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_10a8 = fVar150;
  fStack_10a4 = fVar150;
  fStack_10a0 = fVar150;
  fStack_109c = fVar150;
  local_10b8 = fVar154;
  fStack_10b4 = fVar154;
  fStack_10b0 = fVar154;
  fStack_10ac = fVar154;
  local_fa8 = fVar137;
  fStack_fa4 = fVar137;
  fStack_fa0 = fVar137;
  fStack_f9c = fVar137;
  local_fb8 = fVar147;
  fStack_fb4 = fVar147;
  fStack_fb0 = fVar147;
  fStack_fac = fVar147;
  local_fc8 = fVar164;
  fStack_fc4 = fVar164;
  fStack_fc0 = fVar164;
  fStack_fbc = fVar164;
  local_fd8 = fVar161;
  fStack_fd4 = fVar161;
  fStack_fd0 = fVar161;
  fStack_fcc = fVar161;
  local_fe8 = fVar172;
  fStack_fe4 = fVar172;
  fStack_fe0 = fVar172;
  fStack_fdc = fVar172;
  local_ff8 = fVar193;
  fStack_ff4 = fVar193;
  fStack_ff0 = fVar193;
  fStack_fec = fVar193;
  local_1008 = fVar200;
  fStack_1004 = fVar200;
  fStack_1000 = fVar200;
  fStack_ffc = fVar200;
  local_10f8 = auVar174;
  fVar96 = fVar150;
  fVar201 = fVar150;
  fVar205 = fVar150;
  fVar180 = fVar154;
  fVar98 = fVar154;
  fVar206 = fVar154;
  local_1228 = pre;
  fVar138 = fVar200;
  fVar128 = fVar200;
  fVar127 = fVar200;
  fVar126 = fVar193;
  fVar124 = fVar193;
  fVar123 = fVar193;
  fVar122 = fVar164;
  fVar121 = fVar164;
  fVar120 = fVar164;
  fVar114 = fVar147;
  fVar113 = fVar147;
  fVar112 = fVar147;
  fVar97 = fVar172;
  fVar76 = fVar172;
  fVar75 = fVar172;
  fVar73 = fVar137;
  fVar74 = fVar137;
  fVar72 = fVar137;
  fVar53 = fVar161;
  fVar139 = fVar161;
  fVar125 = fVar161;
LAB_001ffe5f:
  do {
    pSVar13 = pSVar16 + -1;
    pSVar16 = pSVar16 + -1;
    if ((float)pSVar13->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar13->dist == *(float *)(ray + k * 4 + 0x80)) {
      pGVar26 = (GridSOA *)(pSVar16->ptr).ptr;
      while (((ulong)pGVar26 & 8) == 0) {
        pcVar30 = pGVar26->data + (uVar32 - 0x10);
        auVar54._0_4_ = (*(float *)pcVar30 - fVar72) * fVar150;
        auVar54._4_4_ = (*(float *)(pcVar30 + 4) - fVar74) * fVar96;
        auVar54._8_4_ = (*(float *)(pcVar30 + 8) - fVar73) * fVar201;
        auVar54._12_4_ = (*(float *)(pcVar30 + 0xc) - fVar137) * fVar205;
        pcVar30 = pGVar26->data + (uVar33 - 0x10);
        auVar118._0_4_ = (*(float *)pcVar30 - fVar112) * fVar154;
        auVar118._4_4_ = (*(float *)(pcVar30 + 4) - fVar113) * fVar180;
        auVar118._8_4_ = (*(float *)(pcVar30 + 8) - fVar114) * fVar98;
        auVar118._12_4_ = (*(float *)(pcVar30 + 0xc) - fVar147) * fVar206;
        auVar54 = maxps(auVar54,auVar118);
        pcVar30 = pGVar26->data + (uVar27 - 0x10);
        auVar130._0_4_ = (*(float *)pcVar30 - fVar120) * fVar127;
        auVar130._4_4_ = (*(float *)(pcVar30 + 4) - fVar121) * fVar128;
        auVar130._8_4_ = (*(float *)(pcVar30 + 8) - fVar122) * fVar138;
        auVar130._12_4_ = (*(float *)(pcVar30 + 0xc) - fVar164) * fVar200;
        auVar77 = maxps(auVar130,auVar174);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar54,auVar77);
        pcVar30 = pGVar26->data + ((uVar32 ^ 0x10) - 0x10);
        auVar142._0_4_ = (*(float *)pcVar30 - fVar72) * fVar125;
        auVar142._4_4_ = (*(float *)(pcVar30 + 4) - fVar74) * fVar139;
        auVar142._8_4_ = (*(float *)(pcVar30 + 8) - fVar73) * fVar53;
        auVar142._12_4_ = (*(float *)(pcVar30 + 0xc) - fVar137) * fVar161;
        pcVar30 = pGVar26->data + ((uVar33 ^ 0x10) - 0x10);
        auVar99._0_4_ = (*(float *)pcVar30 - fVar112) * fVar75;
        auVar99._4_4_ = (*(float *)(pcVar30 + 4) - fVar113) * fVar76;
        auVar99._8_4_ = (*(float *)(pcVar30 + 8) - fVar114) * fVar97;
        auVar99._12_4_ = (*(float *)(pcVar30 + 0xc) - fVar147) * fVar172;
        auVar54 = minps(auVar142,auVar99);
        pcVar30 = pGVar26->data + ((uVar27 ^ 0x10) - 0x10);
        auVar100._0_4_ = (*(float *)pcVar30 - fVar120) * fVar123;
        auVar100._4_4_ = (*(float *)(pcVar30 + 4) - fVar121) * fVar124;
        auVar100._8_4_ = (*(float *)(pcVar30 + 8) - fVar122) * fVar126;
        auVar100._12_4_ = (*(float *)(pcVar30 + 0xc) - fVar164) * fVar193;
        auVar77 = minps(auVar100,auVar175);
        auVar54 = minps(auVar54,auVar77);
        auVar77._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar54._4_4_);
        auVar77._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar54._0_4_);
        auVar77._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar54._8_4_);
        auVar77._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar54._12_4_);
        uVar24 = movmskps((int)root.ptr,auVar77);
        root.ptr = (size_t)uVar24;
        if (uVar24 == 0) {
          if (pSVar16 == stack) {
            return;
          }
          goto LAB_001ffe5f;
        }
        uVar22 = (ulong)pGVar26 & 0xfffffffffffffff0;
        lVar29 = 0;
        if ((byte)uVar24 != 0) {
          for (; ((byte)uVar24 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
          }
        }
        pGVar26 = *(GridSOA **)(uVar22 + lVar29 * 8);
        uVar24 = (uVar24 & 0xff) - 1 & uVar24 & 0xff;
        root.ptr = (size_t)pGVar26;
        if (uVar24 != 0) {
          uVar34 = tNear.field_0.i[lVar29];
          lVar29 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
            }
          }
          root.ptr = *(ulong *)(uVar22 + lVar29 * 8);
          uVar140 = tNear.field_0.i[lVar29];
          uVar24 = uVar24 - 1 & uVar24;
          if (uVar24 == 0) {
            if (uVar34 < uVar140) {
              (pSVar16->ptr).ptr = root.ptr;
              pSVar16->dist = uVar140;
              pSVar16 = pSVar16 + 1;
              root.ptr = (size_t)pGVar26;
            }
            else {
              (pSVar16->ptr).ptr = (size_t)pGVar26;
              pSVar16->dist = uVar34;
              pSVar16 = pSVar16 + 1;
              pGVar26 = (GridSOA *)root.ptr;
            }
          }
          else {
            auVar55._8_4_ = uVar34;
            auVar55._0_8_ = pGVar26;
            auVar55._12_4_ = 0;
            auVar78._8_4_ = uVar140;
            auVar78._0_8_ = root.ptr;
            auVar78._12_4_ = 0;
            lVar29 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
              }
            }
            uVar18 = *(ulong *)(uVar22 + lVar29 * 8);
            iVar21 = tNear.field_0.i[lVar29];
            auVar101._8_4_ = iVar21;
            auVar101._0_8_ = uVar18;
            auVar101._12_4_ = 0;
            auVar115._8_4_ = -(uint)((int)uVar34 < (int)uVar140);
            uVar24 = uVar24 - 1 & uVar24;
            auVar174 = local_10f8;
            if (uVar24 == 0) {
              auVar115._4_4_ = auVar115._8_4_;
              auVar115._0_4_ = auVar115._8_4_;
              auVar115._12_4_ = auVar115._8_4_;
              auVar54 = auVar55 & auVar115 | ~auVar115 & auVar78;
              auVar77 = auVar78 & auVar115 | ~auVar115 & auVar55;
              auVar116._8_4_ = -(uint)(auVar54._8_4_ < iVar21);
              auVar116._0_8_ = CONCAT44(auVar116._8_4_,auVar116._8_4_);
              auVar116._12_4_ = auVar116._8_4_;
              pGVar26 = (GridSOA *)(~auVar116._0_8_ & uVar18 | auVar54._0_8_ & auVar116._0_8_);
              auVar54 = auVar101 & auVar116 | ~auVar116 & auVar54;
              auVar56._8_4_ = -(uint)(auVar77._8_4_ < auVar54._8_4_);
              auVar56._4_4_ = auVar56._8_4_;
              auVar56._0_4_ = auVar56._8_4_;
              auVar56._12_4_ = auVar56._8_4_;
              *pSVar16 = (StackItemT<embree::NodeRefPtr<4>_>)
                         (~auVar56 & auVar77 | auVar54 & auVar56);
              pSVar16[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                           (auVar77 & auVar56 | ~auVar56 & auVar54);
              pSVar16 = pSVar16 + 2;
              root.ptr = (size_t)pGVar26;
            }
            else {
              lVar29 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                }
              }
              iVar5 = tNear.field_0.i[lVar29];
              auVar129._8_4_ = iVar5;
              auVar129._0_8_ = *(undefined8 *)(uVar22 + lVar29 * 8);
              auVar129._12_4_ = 0;
              auVar117._4_4_ = auVar115._8_4_;
              auVar117._0_4_ = auVar115._8_4_;
              auVar117._8_4_ = auVar115._8_4_;
              auVar117._12_4_ = auVar115._8_4_;
              auVar54 = auVar55 & auVar117 | ~auVar117 & auVar78;
              auVar77 = auVar78 & auVar117 | ~auVar117 & auVar55;
              auVar141._0_4_ = -(uint)(iVar21 < iVar5);
              auVar141._4_4_ = -(uint)(iVar21 < iVar5);
              auVar141._8_4_ = -(uint)(iVar21 < iVar5);
              auVar141._12_4_ = -(uint)(iVar21 < iVar5);
              auVar118 = auVar101 & auVar141 | ~auVar141 & auVar129;
              auVar142 = ~auVar141 & auVar101 | auVar129 & auVar141;
              auVar102._8_4_ = -(uint)(auVar77._8_4_ < auVar142._8_4_);
              auVar102._4_4_ = auVar102._8_4_;
              auVar102._0_4_ = auVar102._8_4_;
              auVar102._12_4_ = auVar102._8_4_;
              auVar130 = auVar77 & auVar102 | ~auVar102 & auVar142;
              auVar79._8_4_ = -(uint)(auVar54._8_4_ < auVar118._8_4_);
              auVar79._0_8_ = CONCAT44(auVar79._8_4_,auVar79._8_4_);
              auVar79._12_4_ = auVar79._8_4_;
              pGVar26 = (GridSOA *)(auVar54._0_8_ & auVar79._0_8_ | ~auVar79._0_8_ & auVar118._0_8_)
              ;
              auVar54 = ~auVar79 & auVar54 | auVar118 & auVar79;
              auVar57._8_4_ = -(uint)(auVar54._8_4_ < auVar130._8_4_);
              auVar57._4_4_ = auVar57._8_4_;
              auVar57._0_4_ = auVar57._8_4_;
              auVar57._12_4_ = auVar57._8_4_;
              *pSVar16 = (StackItemT<embree::NodeRefPtr<4>_>)
                         (~auVar102 & auVar77 | auVar142 & auVar102);
              pSVar16[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                           (~auVar57 & auVar54 | auVar130 & auVar57);
              pSVar16[2] = (StackItemT<embree::NodeRefPtr<4>_>)
                           (auVar54 & auVar57 | ~auVar57 & auVar130);
              pSVar16 = pSVar16 + 3;
              root.ptr = (size_t)pGVar26;
              fVar150 = local_10a8;
              fVar96 = fStack_10a4;
              fVar201 = fStack_10a0;
              fVar205 = fStack_109c;
              fVar154 = local_10b8;
              fVar180 = fStack_10b4;
              fVar98 = fStack_10b0;
              fVar206 = fStack_10ac;
            }
          }
        }
      }
      if (((uint)pGVar26 & 0xf) == 8) {
        pGVar6 = (local_1228->super_Precalculations).grid;
        uVar22 = (ulong)pGVar6->width;
        uVar18 = (ulong)pGVar6->dim_offset;
        lVar29 = ((ulong)pGVar26 >> 4) * 4 + (ulong)pGVar6->gridOffset;
        lVar28 = uVar18 * 4 + lVar29;
        pcVar30 = pGVar6->data + lVar28 + -4;
        pcVar2 = pGVar6->data + uVar18 * 8 + lVar29 + -4;
        pcVar3 = pGVar6->data + ((ulong)pGVar26 >> 4) * 4 + (ulong)pGVar6->gridOffset + -4;
        fVar137 = *(float *)(pcVar3 + 4);
        pcVar23 = pGVar6->data + uVar22 * 4 + lVar29 + -4;
        fVar147 = *(float *)(pcVar23 + 4);
        if (uVar22 == 2) {
          fVar164 = *(float *)pcVar30;
          fVar161 = *(float *)(pGVar6->data + lVar28);
          fVar172 = *(float *)(pGVar6->data + lVar28 + 4);
          fVar193 = *(float *)(pGVar6[1].data + lVar28 + -0x30);
          fVar150 = *(float *)pcVar2;
          fVar96 = *(float *)(pcVar2 + 4);
          fVar201 = *(float *)(pcVar2 + 8);
          fVar205 = *(float *)(pcVar2 + 0xc);
          fVar154 = fVar147;
          fVar180 = fVar193;
          fVar98 = fVar96;
          fVar206 = fVar205;
          fVar125 = fVar161;
          fVar139 = fVar137;
        }
        else {
          fVar164 = *(float *)pcVar30;
          fVar161 = *(float *)(pGVar6->data + lVar28);
          pcVar30 = pcVar30 + uVar22 * 4;
          fVar172 = *(float *)pcVar30;
          fVar193 = *(float *)(pcVar30 + 4);
          fVar150 = *(float *)pcVar2;
          fVar96 = *(float *)(pcVar2 + 4);
          pcVar1 = pcVar2 + uVar22 * 4;
          fVar201 = *(float *)pcVar1;
          fVar205 = *(float *)(pcVar1 + 4);
          fVar154 = *(float *)(pcVar23 + 8);
          fVar180 = *(float *)(pcVar30 + 8);
          fVar98 = *(float *)(pcVar2 + 8);
          fVar206 = *(float *)(pcVar1 + 8);
          fVar125 = *(float *)(pGVar6->data + lVar28 + 4);
          fVar139 = *(float *)(pcVar3 + 8);
        }
        local_1210 = (GridSOA *)(ulong)pGVar6->height;
        lVar28 = uVar18 * 0xc + lVar29;
        local_1220 = pGVar6->data + lVar28 + -4;
        fVar53 = *(float *)(ray + k * 4);
        fVar72 = *(float *)(ray + k * 4 + 0x10);
        fVar74 = *(float *)(ray + k * 4 + 0x20);
        fVar73 = *(float *)(ray + k * 4 + 0x40);
        local_f88 = *(float *)pcVar3 - fVar53;
        fStack_f84 = *(float *)pcVar23 - fVar53;
        fStack_f80 = fVar137 - fVar53;
        fStack_f7c = fVar147 - fVar53;
        fVar164 = fVar164 - fVar72;
        fVar166 = fVar172 - fVar72;
        fVar168 = fVar161 - fVar72;
        fVar170 = fVar193 - fVar72;
        fVar150 = fVar150 - fVar74;
        fVar151 = fVar201 - fVar74;
        fVar152 = fVar96 - fVar74;
        fVar153 = fVar205 - fVar74;
        fVar128 = fVar137 - fVar53;
        fVar137 = fVar137 - fVar53;
        fVar138 = fVar139 - fVar53;
        fVar139 = fVar139 - fVar53;
        fVar112 = fVar161 - fVar72;
        fVar161 = fVar161 - fVar72;
        fVar122 = fVar125 - fVar72;
        fVar125 = fVar125 - fVar72;
        fVar76 = fVar96 - fVar74;
        fVar96 = fVar96 - fVar74;
        fVar97 = fVar98 - fVar74;
        fVar98 = fVar98 - fVar74;
        fVar200 = *(float *)pcVar23 - fVar53;
        fVar145 = fVar147 - fVar53;
        fVar147 = fVar147 - fVar53;
        fVar154 = fVar154 - fVar53;
        fVar172 = fVar172 - fVar72;
        fVar179 = fVar193 - fVar72;
        fVar193 = fVar193 - fVar72;
        fVar180 = fVar180 - fVar72;
        fVar201 = fVar201 - fVar74;
        fVar203 = fVar205 - fVar74;
        fVar205 = fVar205 - fVar74;
        fVar206 = fVar206 - fVar74;
        fVar113 = fVar200 - local_f88;
        fVar120 = fVar145 - fStack_f84;
        fVar123 = fVar147 - fStack_f80;
        fVar126 = fVar154 - fStack_f7c;
        local_10c8 = fVar172 - fVar164;
        fStack_10c4 = fVar179 - fVar166;
        fStack_10c0 = fVar193 - fVar168;
        fStack_10bc = fVar180 - fVar170;
        fVar155 = fVar201 - fVar150;
        fVar157 = fVar203 - fVar151;
        fStack_1200 = fVar205 - fVar152;
        fStack_11fc = fVar206 - fVar153;
        local_10d8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
        local_10e8 = *(float *)(ray + k * 4 + 0x60);
        fVar165 = local_f88 - fVar128;
        fVar167 = fStack_f84 - fVar137;
        fVar169 = fStack_f80 - fVar138;
        fVar171 = fStack_f7c - fVar139;
        fVar162 = (local_10c8 * (fVar201 + fVar150) - (fVar172 + fVar164) * fVar155) * fVar73 +
                  ((fVar200 + local_f88) * fVar155 - (fVar201 + fVar150) * fVar113) *
                  (float)local_10d8._4_4_ +
                  (fVar113 * (fVar172 + fVar164) - (fVar200 + local_f88) * local_10c8) * local_10e8;
        fVar163 = (fStack_10c4 * (fVar203 + fVar151) - (fVar179 + fVar166) * fVar157) * fVar73 +
                  ((fVar145 + fStack_f84) * fVar157 - (fVar203 + fVar151) * fVar120) *
                  (float)local_10d8._4_4_ +
                  (fVar120 * (fVar179 + fVar166) - (fVar145 + fStack_f84) * fStack_10c4) *
                  local_10e8;
        tNear.field_0.v[2] =
             (fStack_10c0 * (fVar205 + fVar152) - (fVar193 + fVar168) * fStack_1200) * fVar73 +
             ((fVar147 + fStack_f80) * fStack_1200 - (fVar205 + fVar152) * fVar123) *
             (float)local_10d8._4_4_ +
             (fVar123 * (fVar193 + fVar168) - (fVar147 + fStack_f80) * fStack_10c0) * local_10e8;
        tNear.field_0.v[3] =
             (fStack_10bc * (fVar206 + fVar153) - (fVar180 + fVar170) * fStack_11fc) * fVar73 +
             ((fVar154 + fStack_f7c) * fStack_11fc - (fVar206 + fVar153) * fVar126) *
             (float)local_10d8._4_4_ +
             (fVar126 * (fVar180 + fVar170) - (fVar154 + fStack_f7c) * fStack_10bc) * local_10e8;
        fVar114 = fVar164 - fVar112;
        fVar121 = fVar166 - fVar161;
        fVar124 = fVar168 - fVar122;
        fVar127 = fVar170 - fVar125;
        fVar183 = fVar150 - fVar76;
        fVar185 = fVar151 - fVar96;
        fVar187 = fVar152 - fVar97;
        fVar189 = fVar153 - fVar98;
        auVar103._0_4_ =
             (fVar114 * (fVar150 + fVar76) - (fVar164 + fVar112) * fVar183) * fVar73 +
             ((local_f88 + fVar128) * fVar183 - (fVar150 + fVar76) * fVar165) *
             (float)local_10d8._4_4_ +
             (fVar165 * (fVar164 + fVar112) - (local_f88 + fVar128) * fVar114) * local_10e8;
        auVar103._4_4_ =
             (fVar121 * (fVar151 + fVar96) - (fVar166 + fVar161) * fVar185) * fVar73 +
             ((fStack_f84 + fVar137) * fVar185 - (fVar151 + fVar96) * fVar167) *
             (float)local_10d8._4_4_ +
             (fVar167 * (fVar166 + fVar161) - (fStack_f84 + fVar137) * fVar121) * local_10e8;
        auVar103._8_4_ =
             (fVar124 * (fVar152 + fVar97) - (fVar168 + fVar122) * fVar187) * fVar73 +
             ((fStack_f80 + fVar138) * fVar187 - (fVar152 + fVar97) * fVar169) *
             (float)local_10d8._4_4_ +
             (fVar169 * (fVar168 + fVar122) - (fStack_f80 + fVar138) * fVar124) * local_10e8;
        auVar103._12_4_ =
             (fVar127 * (fVar153 + fVar98) - (fVar170 + fVar125) * fVar189) * fVar73 +
             ((fStack_f7c + fVar139) * fVar189 - (fVar153 + fVar98) * fVar171) *
             (float)local_10d8._4_4_ +
             (fVar171 * (fVar170 + fVar125) - (fStack_f7c + fVar139) * fVar127) * local_10e8;
        fVar53 = fVar128 - fVar200;
        fVar72 = fVar137 - fVar145;
        fVar74 = fVar138 - fVar147;
        fVar75 = fVar139 - fVar154;
        fVar156 = fVar112 - fVar172;
        fVar158 = fVar161 - fVar179;
        fVar159 = fVar122 - fVar193;
        fVar160 = fVar125 - fVar180;
        fVar184 = fVar76 - fVar201;
        fVar186 = fVar96 - fVar203;
        fVar188 = fVar97 - fVar205;
        fVar190 = fVar98 - fVar206;
        fStack_10e4 = local_10e8;
        fStack_10e0 = local_10e8;
        fStack_10dc = local_10e8;
        local_10d8._0_4_ = local_10d8._4_4_;
        fStack_10d0 = (float)local_10d8._4_4_;
        fStack_10cc = (float)local_10d8._4_4_;
        auVar41._0_4_ =
             (fVar156 * (fVar201 + fVar76) - (fVar172 + fVar112) * fVar184) * fVar73 +
             ((fVar200 + fVar128) * fVar184 - (fVar201 + fVar76) * fVar53) * (float)local_10d8._4_4_
             + (fVar53 * (fVar172 + fVar112) - (fVar200 + fVar128) * fVar156) * local_10e8;
        auVar41._4_4_ =
             (fVar158 * (fVar203 + fVar96) - (fVar179 + fVar161) * fVar186) * fVar73 +
             ((fVar145 + fVar137) * fVar186 - (fVar203 + fVar96) * fVar72) * (float)local_10d8._4_4_
             + (fVar72 * (fVar179 + fVar161) - (fVar145 + fVar137) * fVar158) * local_10e8;
        auVar41._8_4_ =
             (fVar159 * (fVar205 + fVar97) - (fVar193 + fVar122) * fVar188) * fVar73 +
             ((fVar147 + fVar138) * fVar188 - (fVar205 + fVar97) * fVar74) * (float)local_10d8._4_4_
             + (fVar74 * (fVar193 + fVar122) - (fVar147 + fVar138) * fVar159) * local_10e8;
        auVar41._12_4_ =
             (fVar160 * (fVar206 + fVar98) - (fVar180 + fVar125) * fVar190) * fVar73 +
             ((fVar154 + fVar139) * fVar190 - (fVar206 + fVar98) * fVar75) * (float)local_10d8._4_4_
             + (fVar75 * (fVar180 + fVar125) - (fVar154 + fVar139) * fVar160) * local_10e8;
        fVar137 = fVar162 + auVar103._0_4_ + auVar41._0_4_;
        fVar147 = fVar163 + auVar103._4_4_ + auVar41._4_4_;
        fVar161 = tNear.field_0.v[2] + auVar103._8_4_ + auVar41._8_4_;
        fVar172 = tNear.field_0.v[3] + auVar103._12_4_ + auVar41._12_4_;
        auVar173._4_4_ = fVar163;
        auVar173._0_4_ = fVar162;
        auVar173._8_4_ = tNear.field_0.i[2];
        auVar173._12_4_ = tNear.field_0.i[3];
        auVar174 = minps(auVar173,auVar103);
        auVar175 = minps(auVar174,auVar41);
        local_12c8 = CONCAT44(fVar163,fVar162);
        auVar80._4_4_ = fVar163;
        auVar80._0_4_ = fVar162;
        auVar80._8_4_ = tNear.field_0.i[2];
        auVar80._12_4_ = tNear.field_0.i[3];
        auVar174 = maxps(auVar80,auVar103);
        auVar174 = maxps(auVar174,auVar41);
        local_f98 = ABS(fVar137);
        fStack_f94 = ABS(fVar147);
        fStack_f90 = ABS(fVar161);
        fStack_f8c = ABS(fVar172);
        auVar81._4_4_ = -(uint)(auVar174._4_4_ <= fStack_f94 * 1.1920929e-07);
        auVar81._0_4_ = -(uint)(auVar174._0_4_ <= local_f98 * 1.1920929e-07);
        auVar81._8_4_ = -(uint)(auVar174._8_4_ <= fStack_f90 * 1.1920929e-07);
        auVar81._12_4_ = -(uint)(auVar174._12_4_ <= fStack_f8c * 1.1920929e-07);
        auVar176._4_4_ = -(uint)(-(fStack_f94 * 1.1920929e-07) <= auVar175._4_4_);
        auVar176._0_4_ = -(uint)(-(local_f98 * 1.1920929e-07) <= auVar175._0_4_);
        auVar176._8_4_ = -(uint)(-(fStack_f90 * 1.1920929e-07) <= auVar175._8_4_);
        auVar176._12_4_ = -(uint)(-(fStack_f8c * 1.1920929e-07) <= auVar175._12_4_);
        auVar81 = auVar81 | auVar176;
        iVar21 = movmskps((int)local_1220,auVar81);
        uVar14 = SUB84(ray,0);
        uVar20 = (undefined4)((ulong)ray >> 0x20);
        root.ptr = (size_t)local_1210;
        local_11f8 = local_1210;
        if (iVar21 != 0) {
          uVar140 = (uint)DAT_01f7b6c0;
          uVar146 = DAT_01f7b6c0._4_4_;
          uVar148 = DAT_01f7b6c0._8_4_;
          uVar149 = DAT_01f7b6c0._12_4_;
          uVar24 = -(uint)((float)((uint)(fVar156 * fVar183) & uVar140) <=
                          (float)((uint)(fVar114 * fVar155) & uVar140));
          uVar35 = -(uint)((float)((uint)(fVar158 * fVar185) & uVar146) <=
                          (float)((uint)(fVar121 * fVar157) & uVar146));
          uVar37 = -(uint)((float)((uint)(fVar159 * fVar187) & uVar148) <=
                          (float)((uint)(fVar124 * fStack_1200) & uVar148));
          uVar39 = -(uint)((float)((uint)(fVar160 * fVar189) & uVar149) <=
                          (float)((uint)(fVar127 * fStack_11fc) & uVar149));
          auVar8._4_4_ = fVar147;
          auVar8._0_4_ = fVar137;
          auVar8._8_4_ = fVar161;
          auVar8._12_4_ = fVar172;
          uVar34 = -(uint)((float)((uint)(fVar165 * fVar184) & uVar140) <=
                          (float)((uint)(fVar113 * fVar183) & uVar140));
          uVar36 = -(uint)((float)((uint)(fVar167 * fVar186) & uVar146) <=
                          (float)((uint)(fVar120 * fVar185) & uVar146));
          uVar38 = -(uint)((float)((uint)(fVar169 * fVar188) & uVar148) <=
                          (float)((uint)(fVar123 * fVar187) & uVar148));
          uVar40 = -(uint)((float)((uint)(fVar171 * fVar190) & uVar149) <=
                          (float)((uint)(fVar126 * fVar189) & uVar149));
          auVar104._0_4_ = fVar113 * fVar114 - fVar165 * local_10c8;
          auVar104._4_4_ = fVar120 * fVar121 - fVar167 * fStack_10c4;
          auVar104._8_4_ = fVar123 * fVar124 - fVar169 * fStack_10c0;
          auVar104._12_4_ = fVar126 * fVar127 - fVar171 * fStack_10bc;
          uVar140 = -(uint)((float)((uint)(fVar53 * fVar114) & uVar140) <=
                           (float)((uint)(fVar165 * local_10c8) & uVar140));
          uVar146 = -(uint)((float)((uint)(fVar72 * fVar121) & uVar146) <=
                           (float)((uint)(fVar167 * fStack_10c4) & uVar146));
          uVar148 = -(uint)((float)((uint)(fVar74 * fVar124) & uVar148) <=
                           (float)((uint)(fVar169 * fStack_10c0) & uVar148));
          uVar149 = -(uint)((float)((uint)(fVar75 * fVar127) & uVar149) <=
                           (float)((uint)(fVar171 * fStack_10bc) & uVar149));
          local_1128._0_4_ =
               ~uVar24 & (uint)(local_10c8 * fVar183 - fVar114 * fVar155) |
               (uint)(fVar114 * fVar184 - fVar156 * fVar183) & uVar24;
          local_1128._4_4_ =
               ~uVar35 & (uint)(fStack_10c4 * fVar185 - fVar121 * fVar157) |
               (uint)(fVar121 * fVar186 - fVar158 * fVar185) & uVar35;
          fStack_1120 = (float)(~uVar37 & (uint)(fStack_10c0 * fVar187 - fVar124 * fStack_1200) |
                               (uint)(fVar124 * fVar188 - fVar159 * fVar187) & uVar37);
          fStack_111c = (float)(~uVar39 & (uint)(fStack_10bc * fVar189 - fVar127 * fStack_11fc) |
                               (uint)(fVar127 * fVar190 - fVar160 * fVar189) & uVar39);
          local_1118[0] =
               (float)(~uVar34 & (uint)(fVar155 * fVar165 - fVar113 * fVar183) |
                      (uint)(fVar53 * fVar183 - fVar165 * fVar184) & uVar34);
          local_1118[1] =
               (float)(~uVar36 & (uint)(fVar157 * fVar167 - fVar120 * fVar185) |
                      (uint)(fVar72 * fVar185 - fVar167 * fVar186) & uVar36);
          local_1118[2] =
               (float)(~uVar38 & (uint)(fStack_1200 * fVar169 - fVar123 * fVar187) |
                      (uint)(fVar74 * fVar187 - fVar169 * fVar188) & uVar38);
          local_1118[3] =
               (float)(~uVar40 & (uint)(fStack_11fc * fVar171 - fVar126 * fVar189) |
                      (uint)(fVar75 * fVar189 - fVar171 * fVar190) & uVar40);
          local_1108[0] =
               (float)(~uVar140 & (uint)auVar104._0_4_ |
                      (uint)(fVar165 * fVar156 - fVar53 * fVar114) & uVar140);
          local_1108[1] =
               (float)(~uVar146 & (uint)auVar104._4_4_ |
                      (uint)(fVar167 * fVar158 - fVar72 * fVar121) & uVar146);
          local_1108[2] =
               (float)(~uVar148 & (uint)auVar104._8_4_ |
                      (uint)(fVar169 * fVar159 - fVar74 * fVar124) & uVar148);
          local_1108[3] =
               (float)(~uVar149 & (uint)auVar104._12_4_ |
                      (uint)(fVar171 * fVar160 - fVar75 * fVar127) & uVar149);
          fVar193 = fVar73 * (float)local_1128._0_4_ +
                    (float)local_10d8._4_4_ * local_1118[0] + local_10e8 * local_1108[0];
          fVar96 = fVar73 * (float)local_1128._4_4_ +
                   (float)local_10d8._4_4_ * local_1118[1] + local_10e8 * local_1108[1];
          fVar201 = fVar73 * fStack_1120 +
                    (float)local_10d8._4_4_ * local_1118[2] + local_10e8 * local_1108[2];
          fVar205 = fVar73 * fStack_111c +
                    (float)local_10d8._4_4_ * local_1118[3] + local_10e8 * local_1108[3];
          auVar131._0_4_ = fVar193 + fVar193;
          auVar131._4_4_ = fVar96 + fVar96;
          auVar131._8_4_ = fVar201 + fVar201;
          auVar131._12_4_ = fVar205 + fVar205;
          auVar42._0_4_ = fVar164 * local_1118[0] + fVar150 * local_1108[0];
          auVar42._4_4_ = fVar166 * local_1118[1] + fVar151 * local_1108[1];
          auVar42._8_4_ = fVar168 * local_1118[2] + fVar152 * local_1108[2];
          auVar42._12_4_ = fVar170 * local_1118[3] + fVar153 * local_1108[3];
          fVar201 = local_f88 * (float)local_1128._0_4_ + auVar42._0_4_;
          fVar205 = fStack_f84 * (float)local_1128._4_4_ + auVar42._4_4_;
          fVar154 = fStack_f80 * fStack_1120 + auVar42._8_4_;
          fVar180 = fStack_f7c * fStack_111c + auVar42._12_4_;
          auVar174 = rcpps(auVar42,auVar131);
          fVar164 = auVar174._0_4_;
          fVar193 = auVar174._4_4_;
          fVar150 = auVar174._8_4_;
          fVar96 = auVar174._12_4_;
          fVar201 = ((1.0 - auVar131._0_4_ * fVar164) * fVar164 + fVar164) * (fVar201 + fVar201);
          fVar205 = ((1.0 - auVar131._4_4_ * fVar193) * fVar193 + fVar193) * (fVar205 + fVar205);
          fVar150 = ((1.0 - auVar131._8_4_ * fVar150) * fVar150 + fVar150) * (fVar154 + fVar154);
          fVar96 = ((1.0 - auVar131._12_4_ * fVar96) * fVar96 + fVar96) * (fVar180 + fVar180);
          fVar164 = *(float *)(ray + k * 4 + 0x80);
          _old_t = ZEXT416((uint)fVar164);
          fVar193 = *(float *)(ray + k * 4 + 0x30);
          auVar58._0_4_ = -(uint)(fVar201 <= fVar164 && fVar193 <= fVar201) & auVar81._0_4_;
          auVar58._4_4_ = -(uint)(fVar205 <= fVar164 && fVar193 <= fVar205) & auVar81._4_4_;
          auVar58._8_4_ = -(uint)(fVar150 <= fVar164 && fVar193 <= fVar150) & auVar81._8_4_;
          auVar58._12_4_ = -(uint)(fVar96 <= fVar164 && fVar193 <= fVar96) & auVar81._12_4_;
          iVar21 = movmskps(iVar21,auVar58);
          if (iVar21 != 0) {
            valid.field_0.i[0] = auVar58._0_4_ & -(uint)(auVar131._0_4_ != 0.0);
            valid.field_0.i[1] = auVar58._4_4_ & -(uint)(auVar131._4_4_ != 0.0);
            valid.field_0.i[2] = auVar58._8_4_ & -(uint)(auVar131._8_4_ != 0.0);
            valid.field_0.i[3] = auVar58._12_4_ & -(uint)(auVar131._12_4_ != 0.0);
            iVar21 = movmskps(iVar21,(undefined1  [16])valid.field_0);
            if (iVar21 != 0) {
              uStack_1290._0_4_ = pGVar6->_geomID;
              uVar24 = pGVar6->_primID;
              tNear.field_0._0_8_ = local_12c8;
              local_1138[0] = fVar201;
              local_1138[1] = fVar205;
              local_1138[2] = fVar150;
              local_1138[3] = fVar96;
              pGVar31 = (context->scene->geometries).items[(uint)uStack_1290].ptr;
              root.ptr = (size_t)(ulong)*(uint *)(ray + k * 4 + 0x90);
              if ((pGVar31->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                uVar34 = *(uint *)(pGVar6->data + lVar28);
                pcVar30 = local_1220 + uVar22 * 4;
                uVar140 = *(uint *)pcVar30;
                uVar35 = *(uint *)(pcVar30 + 4);
                uVar36 = *(uint *)(pGVar6->data + lVar28 + 4);
                uVar146 = *(uint *)(pcVar30 + 8);
                if (uVar22 == 2) {
                  uVar36 = uVar34;
                  uVar146 = uVar35;
                }
                auVar174 = rcpps(auVar104,auVar8);
                fVar164 = auVar174._0_4_;
                fVar193 = auVar174._4_4_;
                fVar154 = auVar174._8_4_;
                fVar180 = auVar174._12_4_;
                fVar137 = (float)(-(uint)(1e-18 <= local_f98) &
                                 (uint)(((float)DAT_01f7ba10 - fVar137 * fVar164) * fVar164 +
                                       fVar164));
                fVar147 = (float)(-(uint)(1e-18 <= fStack_f94) &
                                 (uint)((DAT_01f7ba10._4_4_ - fVar147 * fVar193) * fVar193 + fVar193
                                       ));
                fVar164 = (float)(-(uint)(1e-18 <= fStack_f90) &
                                 (uint)((DAT_01f7ba10._8_4_ - fVar161 * fVar154) * fVar154 + fVar154
                                       ));
                fVar161 = (float)(-(uint)(1e-18 <= fStack_f8c) &
                                 (uint)((DAT_01f7ba10._12_4_ - fVar172 * fVar180) * fVar180 +
                                       fVar180));
                auVar132._0_4_ = fVar162 * fVar137;
                auVar132._4_4_ = fVar163 * fVar147;
                auVar132._8_4_ = tNear.field_0.v[2] * fVar164;
                auVar132._12_4_ = tNear.field_0.v[3] * fVar161;
                auVar174 = minps(auVar132,_DAT_01f7ba10);
                auVar181._0_4_ = auVar103._0_4_ * fVar137;
                auVar181._4_4_ = auVar103._4_4_ * fVar147;
                auVar181._8_4_ = auVar103._8_4_ * fVar164;
                auVar181._12_4_ = auVar103._12_4_ * fVar161;
                auVar175 = minps(auVar181,_DAT_01f7ba10);
                fVar172 = auVar174._0_4_;
                fVar193 = auVar174._4_4_;
                fVar154 = auVar174._8_4_;
                fVar180 = auVar174._12_4_;
                fVar98 = auVar175._0_4_;
                fVar206 = auVar175._4_4_;
                fVar125 = auVar175._8_4_;
                fVar139 = auVar175._12_4_;
                fVar137 = ((float)DAT_01f7ba10 - fVar172) - fVar98;
                fVar147 = (DAT_01f7ba10._4_4_ - fVar193) - fVar206;
                fVar164 = (DAT_01f7ba10._8_4_ - fVar154) - fVar125;
                fVar161 = (DAT_01f7ba10._12_4_ - fVar180) - fVar139;
                local_1158[0] =
                     (float)(*(uint *)local_1220 & 0xffff) * 0.00012207031 * fVar137 +
                     (float)(uVar140 & 0xffff) * 0.00012207031 * fVar98 +
                     (float)(uVar34 & 0xffff) * 0.00012207031 * fVar172;
                local_1158[1] =
                     (float)(uVar140 & 0xffff) * 0.00012207031 * fVar147 +
                     (float)(uVar35 & 0xffff) * 0.00012207031 * fVar206 +
                     (float)(uVar34 & 0xffff) * 0.00012207031 * fVar193;
                local_1158[2] =
                     (float)(uVar34 & 0xffff) * 0.00012207031 * fVar164 +
                     (float)(uVar35 & 0xffff) * 0.00012207031 * fVar125 +
                     (float)(uVar36 & 0xffff) * 0.00012207031 * fVar154;
                local_1158[3] =
                     (float)(uVar35 & 0xffff) * 0.00012207031 * fVar161 +
                     (float)(uVar146 & 0xffff) * 0.00012207031 * fVar139 +
                     (float)(uVar36 & 0xffff) * 0.00012207031 * fVar180;
                local_1148[0] =
                     fVar137 * (float)(*(uint *)local_1220 >> 0x10) * 0.00012207031 +
                     (float)(uVar140 >> 0x10) * 0.00012207031 * fVar98 +
                     (float)(uVar34 >> 0x10) * 0.00012207031 * fVar172;
                local_1148[1] =
                     fVar147 * (float)(uVar140 >> 0x10) * 0.00012207031 +
                     (float)(uVar35 >> 0x10) * 0.00012207031 * fVar206 +
                     (float)(uVar34 >> 0x10) * 0.00012207031 * fVar193;
                local_1148[2] =
                     fVar164 * (float)(uVar34 >> 0x10) * 0.00012207031 +
                     (float)(uVar35 >> 0x10) * 0.00012207031 * fVar125 +
                     (float)(uVar36 >> 0x10) * 0.00012207031 * fVar154;
                local_1148[3] =
                     fVar161 * (float)(uVar35 >> 0x10) * 0.00012207031 +
                     (float)(uVar146 >> 0x10) * 0.00012207031 * fVar139 +
                     (float)(uVar36 >> 0x10) * 0.00012207031 * fVar180;
                auVar43._0_4_ = (uint)fVar201 & valid.field_0.i[0];
                auVar43._4_4_ = (uint)fVar205 & valid.field_0.i[1];
                auVar43._8_4_ = (uint)fVar150 & valid.field_0.i[2];
                auVar43._12_4_ = (uint)fVar96 & valid.field_0.i[3];
                auVar82._0_8_ =
                     CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                auVar82._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                auVar82._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                auVar82 = auVar82 | auVar43;
                auVar105._4_4_ = auVar82._0_4_;
                auVar105._0_4_ = auVar82._4_4_;
                auVar105._8_4_ = auVar82._12_4_;
                auVar105._12_4_ = auVar82._8_4_;
                auVar174 = minps(auVar105,auVar82);
                auVar44._0_8_ = auVar174._8_8_;
                auVar44._8_4_ = auVar174._0_4_;
                auVar44._12_4_ = auVar174._4_4_;
                auVar174 = minps(auVar44,auVar174);
                uVar146 = -(uint)(auVar174._0_4_ == auVar82._0_4_);
                uVar37 = -(uint)(auVar174._4_4_ == auVar82._4_4_);
                uVar38 = -(uint)(auVar174._8_4_ == auVar82._8_4_);
                uVar148 = -(uint)(auVar174._12_4_ == auVar82._12_4_);
                auVar83._0_4_ = uVar146 & valid.field_0.i[0];
                auVar83._4_4_ = uVar37 & valid.field_0.i[1];
                auVar83._8_4_ = uVar38 & valid.field_0.i[2];
                auVar83._12_4_ = uVar148 & valid.field_0.i[3];
                iVar21 = movmskps((int)local_1220,auVar83);
                uVar34 = 0xffffffff;
                uVar140 = 0xffffffff;
                uVar35 = 0xffffffff;
                uVar36 = 0xffffffff;
                if (iVar21 != 0) {
                  uVar34 = uVar146;
                  uVar140 = uVar37;
                  uVar35 = uVar38;
                  uVar36 = uVar148;
                }
                auVar59._0_4_ = valid.field_0.i[0] & uVar34;
                auVar59._4_4_ = valid.field_0.i[1] & uVar140;
                auVar59._8_4_ = valid.field_0.i[2] & uVar35;
                auVar59._12_4_ = valid.field_0.i[3] & uVar36;
                uVar25 = movmskps(iVar21,auVar59);
                uVar18 = CONCAT44((int)((ulong)local_1220 >> 0x20),uVar25);
                lVar28 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
                  }
                }
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar31->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar137 = local_1158[lVar28];
                  fVar147 = local_1148[lVar28];
                  fVar164 = local_1118[lVar28 + -4];
                  fVar161 = local_1118[lVar28];
                  fVar172 = local_1108[lVar28];
                  *(float *)(ray + k * 4 + 0x80) = local_1138[lVar28];
                  *(float *)(ray + k * 4 + 0xc0) = fVar164;
                  *(float *)(ray + k * 4 + 0xd0) = fVar161;
                  *(float *)(ray + k * 4 + 0xe0) = fVar172;
                  *(float *)(ray + k * 4 + 0xf0) = fVar137;
                  *(float *)(ray + k * 4 + 0x100) = fVar147;
                  *(uint *)(ray + k * 4 + 0x110) = uVar24;
                  *(uint *)(ray + k * 4 + 0x120) = (uint)uStack_1290;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  root.ptr = (size_t)ray;
                }
                else {
                  local_1298 = CONCAT44((uint)uStack_1290,(uint)uStack_1290);
                  uStack_1290._4_4_ = (uint)uStack_1290;
                  local_1278 = CONCAT44(uVar24,uVar24);
                  auVar174 = *(undefined1 (*) [16])(mm_lookupmask_ps + lVar15);
                  local_1218 = uVar22;
                  local_1208 = pGVar31;
                  while( true ) {
                    local_1068 = local_1158[lVar28];
                    fVar137 = local_1148[lVar28];
                    *(float *)(ray + k * 4 + 0x80) = local_1138[lVar28];
                    args.context = context->user;
                    local_1058._4_4_ = fVar137;
                    local_1058._0_4_ = fVar137;
                    local_1058._8_4_ = fVar137;
                    local_1058._12_4_ = fVar137;
                    local_1098 = local_1118[lVar28 + -4];
                    fVar137 = local_1118[lVar28];
                    local_1078 = local_1108[lVar28];
                    local_1088._4_4_ = fVar137;
                    local_1088._0_4_ = fVar137;
                    local_1088._8_4_ = fVar137;
                    local_1088._12_4_ = fVar137;
                    fStack_1094 = local_1098;
                    fStack_1090 = local_1098;
                    fStack_108c = local_1098;
                    fStack_1074 = local_1078;
                    fStack_1070 = local_1078;
                    fStack_106c = local_1078;
                    fStack_1064 = local_1068;
                    fStack_1060 = local_1068;
                    fStack_105c = local_1068;
                    local_1048 = local_1278;
                    uStack_1040 = CONCAT44(uVar24,uVar24);
                    local_1038 = local_1298;
                    uStack_1030 = uStack_1290;
                    local_1028 = (args.context)->instID[0];
                    uStack_1024 = local_1028;
                    uStack_1020 = local_1028;
                    uStack_101c = local_1028;
                    local_1018 = (args.context)->instPrimID[0];
                    uStack_1014 = local_1018;
                    uStack_1010 = local_1018;
                    uStack_100c = local_1018;
                    args.valid = (int *)local_1238;
                    args.geometryUserPtr = pGVar31->userPtr;
                    args.hit = (RTCHitN *)&local_1098;
                    args.N = 4;
                    p_Var19 = pGVar31->intersectionFilterN;
                    root.ptr = (size_t)ray;
                    local_1238 = auVar174;
                    args.ray = (RTCRayN *)ray;
                    if (p_Var19 != (RTCFilterFunctionN)0x0) {
                      auVar175 = (*p_Var19)(&args);
                      root.ptr = auVar175._8_8_;
                      p_Var19 = auVar175._0_8_;
                      pGVar31 = local_1208;
                    }
                    auVar62._0_4_ = -(uint)(local_1238._0_4_ == 0);
                    auVar62._4_4_ = -(uint)(local_1238._4_4_ == 0);
                    auVar62._8_4_ = -(uint)(local_1238._8_4_ == 0);
                    auVar62._12_4_ = -(uint)(local_1238._12_4_ == 0);
                    uVar34 = movmskps((int)p_Var19,auVar62);
                    pRVar17 = (RTCRayN *)(ulong)(uVar34 ^ 0xf);
                    if ((uVar34 ^ 0xf) == 0) {
                      auVar62 = auVar62 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var19 = context->args->filter;
                      auVar11._8_8_ = root.ptr;
                      auVar11._0_8_ = p_Var19;
                      auVar207._8_8_ = root.ptr;
                      auVar207._0_8_ = p_Var19;
                      if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (auVar207 = auVar11, ((pGVar31->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar207 = (*p_Var19)(&args);
                        pGVar31 = local_1208;
                      }
                      root.ptr = auVar207._8_8_;
                      auVar49._0_4_ = -(uint)(local_1238._0_4_ == 0);
                      auVar49._4_4_ = -(uint)(local_1238._4_4_ == 0);
                      auVar49._8_4_ = -(uint)(local_1238._8_4_ == 0);
                      auVar49._12_4_ = -(uint)(local_1238._12_4_ == 0);
                      auVar62 = auVar49 ^ _DAT_01f7ae20;
                      uVar34 = movmskps(auVar207._0_4_,auVar49);
                      pRVar17 = (RTCRayN *)(ulong)(uVar34 ^ 0xf);
                      if ((uVar34 ^ 0xf) != 0) {
                        auVar88._0_4_ = *(uint *)(args.ray + 0xc0) & auVar49._0_4_;
                        auVar88._4_4_ = *(uint *)(args.ray + 0xc4) & auVar49._4_4_;
                        auVar88._8_4_ = *(uint *)(args.ray + 200) & auVar49._8_4_;
                        auVar88._12_4_ = *(uint *)(args.ray + 0xcc) & auVar49._12_4_;
                        auVar143._0_4_ = ~auVar49._0_4_ & *(uint *)args.hit;
                        auVar143._4_4_ = ~auVar49._4_4_ & *(uint *)(args.hit + 4);
                        auVar143._8_4_ = ~auVar49._8_4_ & *(uint *)(args.hit + 8);
                        auVar143._12_4_ = ~auVar49._12_4_ & *(uint *)(args.hit + 0xc);
                        *(undefined1 (*) [16])(args.ray + 0xc0) = auVar143 | auVar88;
                        uVar34 = *(uint *)(args.hit + 0x14);
                        uVar140 = *(uint *)(args.hit + 0x18);
                        uVar35 = *(uint *)(args.hit + 0x1c);
                        *(uint *)(args.ray + 0xd0) =
                             ~auVar49._0_4_ & *(uint *)(args.hit + 0x10) |
                             *(uint *)(args.ray + 0xd0) & auVar49._0_4_;
                        *(uint *)(args.ray + 0xd4) =
                             ~auVar49._4_4_ & uVar34 | *(uint *)(args.ray + 0xd4) & auVar49._4_4_;
                        *(uint *)(args.ray + 0xd8) =
                             ~auVar49._8_4_ & uVar140 | *(uint *)(args.ray + 0xd8) & auVar49._8_4_;
                        *(uint *)(args.ray + 0xdc) =
                             ~auVar49._12_4_ & uVar35 | *(uint *)(args.ray + 0xdc) & auVar49._12_4_;
                        uVar34 = *(uint *)(args.hit + 0x24);
                        uVar140 = *(uint *)(args.hit + 0x28);
                        uVar35 = *(uint *)(args.hit + 0x2c);
                        *(uint *)(args.ray + 0xe0) =
                             ~auVar49._0_4_ & *(uint *)(args.hit + 0x20) |
                             *(uint *)(args.ray + 0xe0) & auVar49._0_4_;
                        *(uint *)(args.ray + 0xe4) =
                             ~auVar49._4_4_ & uVar34 | *(uint *)(args.ray + 0xe4) & auVar49._4_4_;
                        *(uint *)(args.ray + 0xe8) =
                             ~auVar49._8_4_ & uVar140 | *(uint *)(args.ray + 0xe8) & auVar49._8_4_;
                        *(uint *)(args.ray + 0xec) =
                             ~auVar49._12_4_ & uVar35 | *(uint *)(args.ray + 0xec) & auVar49._12_4_;
                        auVar135._0_4_ = *(uint *)(args.ray + 0xf0) & auVar49._0_4_;
                        auVar135._4_4_ = *(uint *)(args.ray + 0xf4) & auVar49._4_4_;
                        auVar135._8_4_ = *(uint *)(args.ray + 0xf8) & auVar49._8_4_;
                        auVar135._12_4_ = *(uint *)(args.ray + 0xfc) & auVar49._12_4_;
                        auVar89._0_4_ = ~auVar49._0_4_ & *(uint *)(args.hit + 0x30);
                        auVar89._4_4_ = ~auVar49._4_4_ & *(uint *)(args.hit + 0x34);
                        auVar89._8_4_ = ~auVar49._8_4_ & *(uint *)(args.hit + 0x38);
                        auVar89._12_4_ = ~auVar49._12_4_ & *(uint *)(args.hit + 0x3c);
                        *(undefined1 (*) [16])(args.ray + 0xf0) = auVar89 | auVar135;
                        uVar34 = *(uint *)(args.hit + 0x44);
                        uVar140 = *(uint *)(args.hit + 0x48);
                        uVar35 = *(uint *)(args.hit + 0x4c);
                        *(uint *)(args.ray + 0x100) =
                             ~auVar49._0_4_ & *(uint *)(args.hit + 0x40) |
                             *(uint *)(args.ray + 0x100) & auVar49._0_4_;
                        *(uint *)(args.ray + 0x104) =
                             ~auVar49._4_4_ & uVar34 | *(uint *)(args.ray + 0x104) & auVar49._4_4_;
                        *(uint *)(args.ray + 0x108) =
                             ~auVar49._8_4_ & uVar140 | *(uint *)(args.ray + 0x108) & auVar49._8_4_;
                        *(uint *)(args.ray + 0x10c) =
                             ~auVar49._12_4_ & uVar35 | *(uint *)(args.ray + 0x10c) & auVar49._12_4_
                        ;
                        uVar34 = *(uint *)(args.hit + 0x54);
                        uVar140 = *(uint *)(args.hit + 0x58);
                        uVar35 = *(uint *)(args.hit + 0x5c);
                        *(uint *)(args.ray + 0x110) =
                             *(uint *)(args.ray + 0x110) & auVar49._0_4_ |
                             ~auVar49._0_4_ & *(uint *)(args.hit + 0x50);
                        *(uint *)(args.ray + 0x114) =
                             *(uint *)(args.ray + 0x114) & auVar49._4_4_ | ~auVar49._4_4_ & uVar34;
                        *(uint *)(args.ray + 0x118) =
                             *(uint *)(args.ray + 0x118) & auVar49._8_4_ | ~auVar49._8_4_ & uVar140;
                        *(uint *)(args.ray + 0x11c) =
                             *(uint *)(args.ray + 0x11c) & auVar49._12_4_ | ~auVar49._12_4_ & uVar35
                        ;
                        uVar34 = *(uint *)(args.hit + 100);
                        uVar140 = *(uint *)(args.hit + 0x68);
                        uVar35 = *(uint *)(args.hit + 0x6c);
                        *(uint *)(args.ray + 0x120) =
                             *(uint *)(args.ray + 0x120) & auVar49._0_4_ |
                             ~auVar49._0_4_ & *(uint *)(args.hit + 0x60);
                        *(uint *)(args.ray + 0x124) =
                             *(uint *)(args.ray + 0x124) & auVar49._4_4_ | ~auVar49._4_4_ & uVar34;
                        *(uint *)(args.ray + 0x128) =
                             *(uint *)(args.ray + 0x128) & auVar49._8_4_ | ~auVar49._8_4_ & uVar140;
                        *(uint *)(args.ray + 300) =
                             *(uint *)(args.ray + 300) & auVar49._12_4_ | ~auVar49._12_4_ & uVar35;
                        auVar90._0_4_ = *(uint *)(args.ray + 0x130) & auVar49._0_4_;
                        auVar90._4_4_ = *(uint *)(args.ray + 0x134) & auVar49._4_4_;
                        auVar90._8_4_ = *(uint *)(args.ray + 0x138) & auVar49._8_4_;
                        auVar90._12_4_ = *(uint *)(args.ray + 0x13c) & auVar49._12_4_;
                        auVar108._0_4_ = ~auVar49._0_4_ & *(uint *)(args.hit + 0x70);
                        auVar108._4_4_ = ~auVar49._4_4_ & *(uint *)(args.hit + 0x74);
                        auVar108._8_4_ = ~auVar49._8_4_ & *(uint *)(args.hit + 0x78);
                        auVar108._12_4_ = ~auVar49._12_4_ & *(uint *)(args.hit + 0x7c);
                        *(undefined1 (*) [16])(args.ray + 0x130) = auVar108 | auVar90;
                        *(undefined1 (*) [16])(args.ray + 0x140) =
                             ~auVar49 & *(undefined1 (*) [16])(args.hit + 0x80) |
                             *(undefined1 (*) [16])(args.ray + 0x140) & auVar49;
                        pRVar17 = args.ray;
                      }
                    }
                    auVar63._0_4_ = auVar62._0_4_ << 0x1f;
                    auVar63._4_4_ = auVar62._4_4_ << 0x1f;
                    auVar63._8_4_ = auVar62._8_4_ << 0x1f;
                    auVar63._12_4_ = auVar62._12_4_ << 0x1f;
                    iVar21 = movmskps((int)pRVar17,auVar63);
                    if (iVar21 == 0) {
                      *(float *)(ray + k * 4 + 0x80) = old_t;
                    }
                    else {
                      old_t = *(float *)(ray + k * 4 + 0x80);
                      uStack_12a4 = 0;
                      uStack_12a0 = 0;
                      uStack_129c = 0;
                    }
                    *(undefined4 *)(local_1238 + lVar28 * 4 + -0x10) = 0;
                    valid.field_0.i[0] = -(uint)(fVar201 <= old_t) & valid.field_0.i[0];
                    valid.field_0.i[1] = -(uint)(fVar205 <= old_t) & valid.field_0.i[1];
                    valid.field_0.i[2] = -(uint)(fVar150 <= old_t) & valid.field_0.i[2];
                    valid.field_0.i[3] = -(uint)(fVar96 <= old_t) & valid.field_0.i[3];
                    iVar21 = movmskps(uVar14,(undefined1  [16])valid.field_0);
                    if (iVar21 == 0) break;
                    auVar64._0_4_ = valid.field_0.i[0] & (uint)fVar201;
                    auVar64._4_4_ = valid.field_0.i[1] & (uint)fVar205;
                    auVar64._8_4_ = valid.field_0.i[2] & (uint)fVar150;
                    auVar64._12_4_ = valid.field_0.i[3] & (uint)fVar96;
                    auVar91._0_8_ =
                         CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                    auVar91._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                    auVar91._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                    auVar91 = auVar91 | auVar64;
                    auVar109._4_4_ = auVar91._0_4_;
                    auVar109._0_4_ = auVar91._4_4_;
                    auVar109._8_4_ = auVar91._12_4_;
                    auVar109._12_4_ = auVar91._8_4_;
                    auVar175 = minps(auVar109,auVar91);
                    auVar65._0_8_ = auVar175._8_8_;
                    auVar65._8_4_ = auVar175._0_4_;
                    auVar65._12_4_ = auVar175._4_4_;
                    auVar175 = minps(auVar65,auVar175);
                    auVar66._0_8_ =
                         CONCAT44(-(uint)(auVar175._4_4_ == auVar91._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar175._0_4_ == auVar91._0_4_) & valid.field_0.i[0]);
                    auVar66._8_4_ = -(uint)(auVar175._8_4_ == auVar91._8_4_) & valid.field_0.i[2];
                    auVar66._12_4_ = -(uint)(auVar175._12_4_ == auVar91._12_4_) & valid.field_0.i[3]
                    ;
                    iVar21 = movmskps(iVar21,auVar66);
                    aVar50 = valid.field_0;
                    if (iVar21 != 0) {
                      aVar50.i[2] = auVar66._8_4_;
                      aVar50._0_8_ = auVar66._0_8_;
                      aVar50.i[3] = auVar66._12_4_;
                    }
                    uVar25 = movmskps(iVar21,(undefined1  [16])aVar50);
                    uVar18 = CONCAT44(uVar20,uVar25);
                    lVar28 = 0;
                    if (uVar18 != 0) {
                      for (; (uVar18 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if (2 < (uint)local_11f8) {
          lVar29 = uVar22 * 4 + lVar29;
          pcVar23 = pGVar6->data + lVar29 + -4;
          pGVar26 = (local_1228->super_Precalculations).grid;
          uVar18 = (ulong)pGVar26->dim_offset;
          pcVar30 = pcVar23 + uVar18 * 4;
          pcVar2 = pcVar23 + uVar18 * 8;
          fVar137 = *(float *)(pGVar6->data + lVar29);
          pcVar3 = pcVar23 + uVar22 * 4;
          fVar147 = *(float *)(pcVar3 + 4);
          if (uVar22 == 2) {
            fVar164 = *(float *)pcVar30;
            fVar161 = *(float *)(pcVar30 + 4);
            fVar172 = *(float *)(pcVar30 + 8);
            fVar193 = *(float *)(pcVar30 + 0xc);
            fVar150 = *(float *)pcVar2;
            fVar96 = *(float *)(pcVar2 + 4);
            fVar201 = *(float *)(pcVar2 + 8);
            fVar205 = *(float *)(pcVar2 + 0xc);
            fVar154 = fVar147;
            fVar180 = fVar161;
            fVar98 = fVar193;
            fVar206 = fVar96;
            fVar125 = fVar205;
            fVar139 = fVar137;
          }
          else {
            fVar164 = *(float *)pcVar30;
            fVar161 = *(float *)(pcVar30 + 8);
            pcVar1 = pcVar30 + uVar22 * 4;
            fVar172 = *(float *)pcVar1;
            fVar193 = *(float *)(pcVar1 + 4);
            fVar150 = *(float *)pcVar2;
            fVar96 = *(float *)(pcVar2 + 4);
            pcVar4 = pcVar2 + uVar22 * 4;
            fVar201 = *(float *)pcVar4;
            fVar205 = *(float *)(pcVar4 + 4);
            fVar154 = *(float *)(pcVar3 + 8);
            fVar180 = *(float *)(pcVar30 + 4);
            fVar98 = *(float *)(pcVar1 + 8);
            fVar206 = *(float *)(pcVar2 + 8);
            fVar125 = *(float *)(pcVar4 + 8);
            fVar139 = *(float *)(pGVar6->data + lVar29 + 4);
          }
          root.ptr = uVar18 * 0xc;
          local_1220 = pcVar23 + uVar18 * 0xc;
          local_1210 = local_11f8;
          fVar53 = *(float *)(ray + k * 4);
          fVar72 = *(float *)(ray + k * 4 + 0x10);
          fVar74 = *(float *)(ray + k * 4 + 0x20);
          fStack_11f0 = *(float *)(ray + k * 4 + 0x40);
          fVar153 = *(float *)pcVar23 - fVar53;
          fVar157 = *(float *)pcVar3 - fVar53;
          fVar160 = fVar137 - fVar53;
          fVar165 = fVar147 - fVar53;
          fVar164 = fVar164 - fVar72;
          fVar179 = fVar172 - fVar72;
          fVar183 = fVar180 - fVar72;
          fVar184 = fVar193 - fVar72;
          fVar150 = fVar150 - fVar74;
          fVar145 = fVar201 - fVar74;
          fVar151 = fVar96 - fVar74;
          fVar152 = fVar205 - fVar74;
          fVar124 = fVar137 - fVar53;
          fVar137 = fVar137 - fVar53;
          fVar126 = fVar139 - fVar53;
          fVar139 = fVar139 - fVar53;
          fVar168 = fVar180 - fVar72;
          fVar180 = fVar180 - fVar72;
          fVar171 = fVar161 - fVar72;
          fVar161 = fVar161 - fVar72;
          fVar97 = fVar96 - fVar74;
          fVar96 = fVar96 - fVar74;
          fVar112 = fVar206 - fVar74;
          fVar206 = fVar206 - fVar74;
          fVar122 = *(float *)pcVar3 - fVar53;
          fVar123 = fVar147 - fVar53;
          fVar147 = fVar147 - fVar53;
          fVar154 = fVar154 - fVar53;
          fVar172 = fVar172 - fVar72;
          fVar185 = fVar193 - fVar72;
          fVar193 = fVar193 - fVar72;
          fVar98 = fVar98 - fVar72;
          fVar201 = fVar201 - fVar74;
          fVar204 = fVar205 - fVar74;
          fVar205 = fVar205 - fVar74;
          fVar125 = fVar125 - fVar74;
          fVar127 = fVar122 - fVar153;
          fVar128 = fVar123 - fVar157;
          fVar138 = fVar147 - fVar160;
          fVar200 = fVar154 - fVar165;
          fVar194 = fVar172 - fVar164;
          fVar196 = fVar185 - fVar179;
          fStack_1200 = fVar193 - fVar183;
          fStack_11fc = fVar98 - fVar184;
          fVar155 = fVar201 - fVar150;
          fVar158 = fVar204 - fVar145;
          fVar162 = fVar205 - fVar151;
          fVar166 = fVar125 - fVar152;
          fVar53 = *(float *)(ray + k * 4 + 0x50);
          local_1208 = (Geometry *)CONCAT44(fVar196,fVar194);
          fVar72 = *(float *)(ray + k * 4 + 0x60);
          local_10d8._4_4_ = fVar72;
          local_10d8._0_4_ = fVar72;
          fStack_10d0 = fVar72;
          fStack_10cc = fVar72;
          fVar156 = fVar153 - fVar124;
          fVar159 = fVar157 - fVar137;
          fVar163 = fVar160 - fVar126;
          fVar167 = fVar165 - fVar139;
          fVar169 = (fVar194 * (fVar201 + fVar150) - (fVar172 + fVar164) * fVar155) * fStack_11f0 +
                    ((fVar122 + fVar153) * fVar155 - (fVar201 + fVar150) * fVar127) * fVar53 +
                    (fVar127 * (fVar172 + fVar164) - (fVar122 + fVar153) * fVar194) * fVar72;
          fVar170 = (fVar196 * (fVar204 + fVar145) - (fVar185 + fVar179) * fVar158) * fStack_11f0 +
                    ((fVar123 + fVar157) * fVar158 - (fVar204 + fVar145) * fVar128) * fVar53 +
                    (fVar128 * (fVar185 + fVar179) - (fVar123 + fVar157) * fVar196) * fVar72;
          tNear.field_0.v[2] =
               (fStack_1200 * (fVar205 + fVar151) - (fVar193 + fVar183) * fVar162) * fStack_11f0 +
               ((fVar147 + fVar160) * fVar162 - (fVar205 + fVar151) * fVar138) * fVar53 +
               (fVar138 * (fVar193 + fVar183) - (fVar147 + fVar160) * fStack_1200) * fVar72;
          tNear.field_0.v[3] =
               (fStack_11fc * (fVar125 + fVar152) - (fVar98 + fVar184) * fVar166) * fStack_11f0 +
               ((fVar154 + fVar165) * fVar166 - (fVar125 + fVar152) * fVar200) * fVar53 +
               (fVar200 * (fVar98 + fVar184) - (fVar154 + fVar165) * fStack_11fc) * fVar72;
          fVar113 = fVar164 - fVar168;
          fVar114 = fVar179 - fVar180;
          fVar120 = fVar183 - fVar171;
          fVar121 = fVar184 - fVar161;
          fVar186 = fVar150 - fVar97;
          fVar188 = fVar145 - fVar96;
          fVar190 = fVar151 - fVar112;
          fVar191 = fVar152 - fVar206;
          auVar133._0_4_ =
               (fVar113 * (fVar150 + fVar97) - (fVar164 + fVar168) * fVar186) * fStack_11f0 +
               ((fVar153 + fVar124) * fVar186 - (fVar150 + fVar97) * fVar156) * fVar53 +
               (fVar156 * (fVar164 + fVar168) - (fVar153 + fVar124) * fVar113) * fVar72;
          auVar133._4_4_ =
               (fVar114 * (fVar145 + fVar96) - (fVar179 + fVar180) * fVar188) * fStack_11f0 +
               ((fVar157 + fVar137) * fVar188 - (fVar145 + fVar96) * fVar159) * fVar53 +
               (fVar159 * (fVar179 + fVar180) - (fVar157 + fVar137) * fVar114) * fVar72;
          auVar133._8_4_ =
               (fVar120 * (fVar151 + fVar112) - (fVar183 + fVar171) * fVar190) * fStack_11f0 +
               ((fVar160 + fVar126) * fVar190 - (fVar151 + fVar112) * fVar163) * fVar53 +
               (fVar163 * (fVar183 + fVar171) - (fVar160 + fVar126) * fVar120) * fVar72;
          auVar133._12_4_ =
               (fVar121 * (fVar152 + fVar206) - (fVar184 + fVar161) * fVar191) * fStack_11f0 +
               ((fVar165 + fVar139) * fVar191 - (fVar152 + fVar206) * fVar167) * fVar53 +
               (fVar167 * (fVar184 + fVar161) - (fVar165 + fVar139) * fVar121) * fVar72;
          fVar74 = fVar124 - fVar122;
          fVar73 = fVar137 - fVar123;
          fVar75 = fVar126 - fVar147;
          fVar76 = fVar139 - fVar154;
          fVar195 = fVar168 - fVar172;
          fVar197 = fVar180 - fVar185;
          fVar198 = fVar171 - fVar193;
          fVar199 = fVar161 - fVar98;
          fVar187 = fVar97 - fVar201;
          fVar189 = fVar96 - fVar204;
          fVar203 = fVar112 - fVar205;
          fVar192 = fVar206 - fVar125;
          auVar45._0_4_ =
               (fVar195 * (fVar201 + fVar97) - (fVar172 + fVar168) * fVar187) * fStack_11f0 +
               ((fVar122 + fVar124) * fVar187 - (fVar201 + fVar97) * fVar74) * fVar53 +
               (fVar74 * (fVar172 + fVar168) - (fVar122 + fVar124) * fVar195) * fVar72;
          auVar45._4_4_ =
               (fVar197 * (fVar204 + fVar96) - (fVar185 + fVar180) * fVar189) * fStack_11f0 +
               ((fVar123 + fVar137) * fVar189 - (fVar204 + fVar96) * fVar73) * fVar53 +
               (fVar73 * (fVar185 + fVar180) - (fVar123 + fVar137) * fVar197) * fVar72;
          auVar45._8_4_ =
               (fVar198 * (fVar205 + fVar112) - (fVar193 + fVar171) * fVar203) * fStack_11f0 +
               ((fVar147 + fVar126) * fVar203 - (fVar205 + fVar112) * fVar75) * fVar53 +
               (fVar75 * (fVar193 + fVar171) - (fVar147 + fVar126) * fVar198) * fVar72;
          auVar45._12_4_ =
               (fVar199 * (fVar125 + fVar206) - (fVar98 + fVar161) * fVar192) * fStack_11f0 +
               ((fVar154 + fVar139) * fVar192 - (fVar125 + fVar206) * fVar76) * fVar53 +
               (fVar76 * (fVar98 + fVar161) - (fVar154 + fVar139) * fVar199) * fVar72;
          local_10c8 = fVar169 + auVar133._0_4_ + auVar45._0_4_;
          fStack_10c4 = fVar170 + auVar133._4_4_ + auVar45._4_4_;
          fStack_10c0 = tNear.field_0.v[2] + auVar133._8_4_ + auVar45._8_4_;
          fStack_10bc = tNear.field_0.v[3] + auVar133._12_4_ + auVar45._12_4_;
          auVar177._4_4_ = fVar170;
          auVar177._0_4_ = fVar169;
          auVar177._8_4_ = tNear.field_0.i[2];
          auVar177._12_4_ = tNear.field_0.i[3];
          auVar174 = minps(auVar177,auVar133);
          auVar175 = minps(auVar174,auVar45);
          local_12c8 = CONCAT44(fVar170,fVar169);
          auVar84._4_4_ = fVar170;
          auVar84._0_4_ = fVar169;
          auVar84._8_4_ = tNear.field_0.i[2];
          auVar84._12_4_ = tNear.field_0.i[3];
          auVar174 = maxps(auVar84,auVar133);
          auVar174 = maxps(auVar174,auVar45);
          local_10e8 = ABS(local_10c8);
          fStack_10e4 = ABS(fStack_10c4);
          fStack_10e0 = ABS(fStack_10c0);
          fStack_10dc = ABS(fStack_10bc);
          auVar85._4_4_ = -(uint)(auVar174._4_4_ <= fStack_10e4 * 1.1920929e-07);
          auVar85._0_4_ = -(uint)(auVar174._0_4_ <= local_10e8 * 1.1920929e-07);
          auVar85._8_4_ = -(uint)(auVar174._8_4_ <= fStack_10e0 * 1.1920929e-07);
          auVar85._12_4_ = -(uint)(auVar174._12_4_ <= fStack_10dc * 1.1920929e-07);
          auVar178._4_4_ = -(uint)(-(fStack_10e4 * 1.1920929e-07) <= auVar175._4_4_);
          auVar178._0_4_ = -(uint)(-(local_10e8 * 1.1920929e-07) <= auVar175._0_4_);
          auVar178._8_4_ = -(uint)(-(fStack_10e0 * 1.1920929e-07) <= auVar175._8_4_);
          auVar178._12_4_ = -(uint)(-(fStack_10dc * 1.1920929e-07) <= auVar175._12_4_);
          auVar85 = auVar85 | auVar178;
          iVar21 = movmskps(uVar14,auVar85);
          fStack_11ec = fStack_11f0;
          if (iVar21 != 0) {
            uVar24 = -(uint)(ABS(fVar195 * fVar186) <= ABS(fVar113 * fVar155));
            uVar35 = -(uint)(ABS(fVar197 * fVar188) <= ABS(fVar114 * fVar158));
            uVar37 = -(uint)(ABS(fVar198 * fVar190) <= ABS(fVar120 * fVar162));
            uVar39 = -(uint)(ABS(fVar199 * fVar191) <= ABS(fVar121 * fVar166));
            auVar9._4_4_ = fStack_10c4;
            auVar9._0_4_ = local_10c8;
            auVar9._8_4_ = fStack_10c0;
            auVar9._12_4_ = fStack_10bc;
            uVar34 = -(uint)(ABS(fVar156 * fVar187) <= ABS(fVar127 * fVar186));
            uVar36 = -(uint)(ABS(fVar159 * fVar189) <= ABS(fVar128 * fVar188));
            uVar38 = -(uint)(ABS(fVar163 * fVar203) <= ABS(fVar138 * fVar190));
            uVar40 = -(uint)(ABS(fVar167 * fVar192) <= ABS(fVar200 * fVar191));
            uVar140 = -(uint)(ABS(fVar74 * fVar113) <= ABS(fVar156 * fVar194));
            uVar146 = -(uint)(ABS(fVar73 * fVar114) <= ABS(fVar159 * fVar196));
            uVar148 = -(uint)(ABS(fVar75 * fVar120) <= ABS(fVar163 * fStack_1200));
            uVar149 = -(uint)(ABS(fVar76 * fVar121) <= ABS(fVar167 * fStack_11fc));
            auVar106._0_4_ = (uint)(fVar113 * fVar187 - fVar195 * fVar186) & uVar24;
            auVar106._4_4_ = (uint)(fVar114 * fVar189 - fVar197 * fVar188) & uVar35;
            auVar106._8_4_ = (uint)(fVar120 * fVar203 - fVar198 * fVar190) & uVar37;
            auVar106._12_4_ = (uint)(fVar121 * fVar192 - fVar199 * fVar191) & uVar39;
            auVar202._0_4_ = ~uVar24 & (uint)(fVar194 * fVar186 - fVar113 * fVar155);
            auVar202._4_4_ = ~uVar35 & (uint)(fVar196 * fVar188 - fVar114 * fVar158);
            auVar202._8_4_ = ~uVar37 & (uint)(fStack_1200 * fVar190 - fVar120 * fVar162);
            auVar202._12_4_ = ~uVar39 & (uint)(fStack_11fc * fVar191 - fVar121 * fVar166);
            _local_1128 = auVar202 | auVar106;
            local_1118[0] =
                 (float)(~uVar34 & (uint)(fVar155 * fVar156 - fVar127 * fVar186) |
                        (uint)(fVar74 * fVar186 - fVar156 * fVar187) & uVar34);
            local_1118[1] =
                 (float)(~uVar36 & (uint)(fVar158 * fVar159 - fVar128 * fVar188) |
                        (uint)(fVar73 * fVar188 - fVar159 * fVar189) & uVar36);
            local_1118[2] =
                 (float)(~uVar38 & (uint)(fVar162 * fVar163 - fVar138 * fVar190) |
                        (uint)(fVar75 * fVar190 - fVar163 * fVar203) & uVar38);
            local_1118[3] =
                 (float)(~uVar40 & (uint)(fVar166 * fVar167 - fVar200 * fVar191) |
                        (uint)(fVar76 * fVar191 - fVar167 * fVar192) & uVar40);
            local_1108[0] =
                 (float)(~uVar140 & (uint)(fVar127 * fVar113 - fVar156 * fVar194) |
                        (uint)(fVar156 * fVar195 - fVar74 * fVar113) & uVar140);
            local_1108[1] =
                 (float)(~uVar146 & (uint)(fVar128 * fVar114 - fVar159 * fVar196) |
                        (uint)(fVar159 * fVar197 - fVar73 * fVar114) & uVar146);
            local_1108[2] =
                 (float)(~uVar148 & (uint)(fVar138 * fVar120 - fVar163 * fStack_1200) |
                        (uint)(fVar163 * fVar198 - fVar75 * fVar120) & uVar148);
            local_1108[3] =
                 (float)(~uVar149 & (uint)(fVar200 * fVar121 - fVar167 * fStack_11fc) |
                        (uint)(fVar167 * fVar199 - fVar76 * fVar121) & uVar149);
            fVar137 = fStack_11f0 * local_1128._0_4_ +
                      fVar53 * local_1118[0] + fVar72 * local_1108[0];
            fVar147 = fStack_11f0 * local_1128._4_4_ +
                      fVar53 * local_1118[1] + fVar72 * local_1108[1];
            fVar161 = fStack_11f0 * local_1128._8_4_ +
                      fVar53 * local_1118[2] + fVar72 * local_1108[2];
            fVar172 = fStack_11f0 * local_1128._12_4_ +
                      fVar53 * local_1118[3] + fVar72 * local_1108[3];
            auVar119._0_4_ = fVar137 + fVar137;
            auVar119._4_4_ = fVar147 + fVar147;
            auVar119._8_4_ = fVar161 + fVar161;
            auVar119._12_4_ = fVar172 + fVar172;
            auVar46._0_4_ = fVar164 * local_1118[0] + fVar150 * local_1108[0];
            auVar46._4_4_ = fVar179 * local_1118[1] + fVar145 * local_1108[1];
            auVar46._8_4_ = fVar183 * local_1118[2] + fVar151 * local_1108[2];
            auVar46._12_4_ = fVar184 * local_1118[3] + fVar152 * local_1108[3];
            fVar172 = fVar153 * local_1128._0_4_ + auVar46._0_4_;
            fVar193 = fVar157 * local_1128._4_4_ + auVar46._4_4_;
            fVar150 = fVar160 * local_1128._8_4_ + auVar46._8_4_;
            fVar96 = fVar165 * local_1128._12_4_ + auVar46._12_4_;
            auVar174 = rcpps(auVar46,auVar119);
            fVar137 = auVar174._0_4_;
            fVar147 = auVar174._4_4_;
            fVar164 = auVar174._8_4_;
            fVar161 = auVar174._12_4_;
            fVar172 = ((1.0 - auVar119._0_4_ * fVar137) * fVar137 + fVar137) * (fVar172 + fVar172);
            fVar193 = ((1.0 - auVar119._4_4_ * fVar147) * fVar147 + fVar147) * (fVar193 + fVar193);
            fVar164 = ((1.0 - auVar119._8_4_ * fVar164) * fVar164 + fVar164) * (fVar150 + fVar150);
            fVar161 = ((1.0 - auVar119._12_4_ * fVar161) * fVar161 + fVar161) * (fVar96 + fVar96);
            fVar137 = *(float *)(ray + k * 4 + 0x80);
            _old_t_1 = ZEXT416((uint)fVar137);
            fVar147 = *(float *)(ray + k * 4 + 0x30);
            auVar60._0_4_ = -(uint)(fVar172 <= fVar137 && fVar147 <= fVar172) & auVar85._0_4_;
            auVar60._4_4_ = -(uint)(fVar193 <= fVar137 && fVar147 <= fVar193) & auVar85._4_4_;
            auVar60._8_4_ = -(uint)(fVar164 <= fVar137 && fVar147 <= fVar164) & auVar85._8_4_;
            auVar60._12_4_ = -(uint)(fVar161 <= fVar137 && fVar147 <= fVar161) & auVar85._12_4_;
            iVar21 = movmskps(uVar14,auVar60);
            if (iVar21 != 0) {
              valid.field_0.i[0] = auVar60._0_4_ & -(uint)(auVar119._0_4_ != 0.0);
              valid.field_0.i[1] = auVar60._4_4_ & -(uint)(auVar119._4_4_ != 0.0);
              valid.field_0.i[2] = auVar60._8_4_ & -(uint)(auVar119._8_4_ != 0.0);
              valid.field_0.i[3] = auVar60._12_4_ & -(uint)(auVar119._12_4_ != 0.0);
              iVar21 = movmskps(iVar21,(undefined1  [16])valid.field_0);
              if (iVar21 != 0) {
                uVar24 = pGVar26->_geomID;
                fVar137 = (float)pGVar26->_primID;
                tNear.field_0._0_8_ = local_12c8;
                local_1138[0] = fVar172;
                local_1138[1] = fVar193;
                local_1138[2] = fVar164;
                local_1138[3] = fVar161;
                pGVar31 = (context->scene->geometries).items[uVar24].ptr;
                root.ptr = (size_t)(ulong)*(uint *)(ray + k * 4 + 0x90);
                if ((pGVar31->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  uVar34 = *(uint *)(local_1220 + 4);
                  pcVar30 = local_1220 + uVar22 * 4;
                  uVar140 = *(uint *)pcVar30;
                  uVar35 = *(uint *)(pcVar30 + 4);
                  uVar36 = *(uint *)(local_1220 + 8);
                  uVar146 = *(uint *)(pcVar30 + 8);
                  if (uVar22 == 2) {
                    uVar36 = uVar34;
                    uVar146 = uVar35;
                  }
                  auVar174 = rcpps(auVar106,auVar9);
                  fVar147 = auVar174._0_4_;
                  fVar150 = auVar174._4_4_;
                  fVar96 = auVar174._8_4_;
                  fVar201 = auVar174._12_4_;
                  fVar147 = (float)(-(uint)(1e-18 <= local_10e8) &
                                   (uint)(((float)DAT_01f7ba10 - local_10c8 * fVar147) * fVar147 +
                                         fVar147));
                  fVar150 = (float)(-(uint)(1e-18 <= fStack_10e4) &
                                   (uint)((DAT_01f7ba10._4_4_ - fStack_10c4 * fVar150) * fVar150 +
                                         fVar150));
                  fVar96 = (float)(-(uint)(1e-18 <= fStack_10e0) &
                                  (uint)((DAT_01f7ba10._8_4_ - fStack_10c0 * fVar96) * fVar96 +
                                        fVar96));
                  fVar201 = (float)(-(uint)(1e-18 <= fStack_10dc) &
                                   (uint)((DAT_01f7ba10._12_4_ - fStack_10bc * fVar201) * fVar201 +
                                         fVar201));
                  auVar182._0_4_ = fVar169 * fVar147;
                  auVar182._4_4_ = fVar170 * fVar150;
                  auVar182._8_4_ = tNear.field_0.v[2] * fVar96;
                  auVar182._12_4_ = tNear.field_0.v[3] * fVar201;
                  auVar175 = minps(auVar182,_DAT_01f7ba10);
                  auVar134._0_4_ = auVar133._0_4_ * fVar147;
                  auVar134._4_4_ = auVar133._4_4_ * fVar150;
                  auVar134._8_4_ = auVar133._8_4_ * fVar96;
                  auVar134._12_4_ = auVar133._12_4_ * fVar201;
                  auVar174 = minps(auVar134,_DAT_01f7ba10);
                  fVar206 = auVar175._0_4_;
                  fVar125 = auVar175._4_4_;
                  fVar139 = auVar175._8_4_;
                  fVar53 = auVar175._12_4_;
                  fVar205 = auVar174._0_4_;
                  fVar154 = auVar174._4_4_;
                  fVar180 = auVar174._8_4_;
                  fVar98 = auVar174._12_4_;
                  fVar147 = ((float)DAT_01f7ba10 - fVar206) - fVar205;
                  fVar150 = (DAT_01f7ba10._4_4_ - fVar125) - fVar154;
                  fVar96 = (DAT_01f7ba10._8_4_ - fVar139) - fVar180;
                  fVar201 = (DAT_01f7ba10._12_4_ - fVar53) - fVar98;
                  local_1158[0] =
                       (float)(*(uint *)local_1220 & 0xffff) * 0.00012207031 * fVar147 +
                       (float)(uVar140 & 0xffff) * 0.00012207031 * fVar205 +
                       (float)(uVar34 & 0xffff) * 0.00012207031 * fVar206;
                  local_1158[1] =
                       (float)(uVar140 & 0xffff) * 0.00012207031 * fVar150 +
                       (float)(uVar35 & 0xffff) * 0.00012207031 * fVar154 +
                       (float)(uVar34 & 0xffff) * 0.00012207031 * fVar125;
                  local_1158[2] =
                       (float)(uVar34 & 0xffff) * 0.00012207031 * fVar96 +
                       (float)(uVar35 & 0xffff) * 0.00012207031 * fVar180 +
                       (float)(uVar36 & 0xffff) * 0.00012207031 * fVar139;
                  local_1158[3] =
                       (float)(uVar35 & 0xffff) * 0.00012207031 * fVar201 +
                       (float)(uVar146 & 0xffff) * 0.00012207031 * fVar98 +
                       (float)(uVar36 & 0xffff) * 0.00012207031 * fVar53;
                  local_1148[0] =
                       fVar147 * (float)(*(uint *)local_1220 >> 0x10) * 0.00012207031 +
                       (float)(uVar140 >> 0x10) * 0.00012207031 * fVar205 +
                       (float)(uVar34 >> 0x10) * 0.00012207031 * fVar206;
                  local_1148[1] =
                       fVar150 * (float)(uVar140 >> 0x10) * 0.00012207031 +
                       (float)(uVar35 >> 0x10) * 0.00012207031 * fVar154 +
                       (float)(uVar34 >> 0x10) * 0.00012207031 * fVar125;
                  local_1148[2] =
                       fVar96 * (float)(uVar34 >> 0x10) * 0.00012207031 +
                       (float)(uVar35 >> 0x10) * 0.00012207031 * fVar180 +
                       (float)(uVar36 >> 0x10) * 0.00012207031 * fVar139;
                  local_1148[3] =
                       fVar201 * (float)(uVar35 >> 0x10) * 0.00012207031 +
                       (float)(uVar146 >> 0x10) * 0.00012207031 * fVar98 +
                       (float)(uVar36 >> 0x10) * 0.00012207031 * fVar53;
                  auVar47._0_4_ = (uint)fVar172 & valid.field_0.i[0];
                  auVar47._4_4_ = (uint)fVar193 & valid.field_0.i[1];
                  auVar47._8_4_ = (uint)fVar164 & valid.field_0.i[2];
                  auVar47._12_4_ = (uint)fVar161 & valid.field_0.i[3];
                  auVar86._0_8_ =
                       CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                  auVar86._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                  auVar86._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                  auVar86 = auVar86 | auVar47;
                  auVar107._4_4_ = auVar86._0_4_;
                  auVar107._0_4_ = auVar86._4_4_;
                  auVar107._8_4_ = auVar86._12_4_;
                  auVar107._12_4_ = auVar86._8_4_;
                  auVar174 = minps(auVar107,auVar86);
                  auVar48._0_8_ = auVar174._8_8_;
                  auVar48._8_4_ = auVar174._0_4_;
                  auVar48._12_4_ = auVar174._4_4_;
                  auVar174 = minps(auVar48,auVar174);
                  uVar146 = -(uint)(auVar174._0_4_ == auVar86._0_4_);
                  uVar37 = -(uint)(auVar174._4_4_ == auVar86._4_4_);
                  uVar38 = -(uint)(auVar174._8_4_ == auVar86._8_4_);
                  uVar148 = -(uint)(auVar174._12_4_ == auVar86._12_4_);
                  auVar87._0_4_ = uVar146 & valid.field_0.i[0];
                  auVar87._4_4_ = uVar37 & valid.field_0.i[1];
                  auVar87._8_4_ = uVar38 & valid.field_0.i[2];
                  auVar87._12_4_ = uVar148 & valid.field_0.i[3];
                  iVar21 = movmskps((int)local_1220,auVar87);
                  uVar34 = 0xffffffff;
                  uVar140 = 0xffffffff;
                  uVar35 = 0xffffffff;
                  uVar36 = 0xffffffff;
                  if (iVar21 != 0) {
                    uVar34 = uVar146;
                    uVar140 = uVar37;
                    uVar35 = uVar38;
                    uVar36 = uVar148;
                  }
                  auVar61._0_4_ = valid.field_0.i[0] & uVar34;
                  auVar61._4_4_ = valid.field_0.i[1] & uVar140;
                  auVar61._8_4_ = valid.field_0.i[2] & uVar35;
                  auVar61._12_4_ = valid.field_0.i[3] & uVar36;
                  uVar25 = movmskps(iVar21,auVar61);
                  uVar18 = CONCAT44((int)((ulong)local_1220 >> 0x20),uVar25);
                  lVar29 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar31->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar147 = local_1158[lVar29];
                    fVar164 = local_1148[lVar29];
                    fVar161 = local_1118[lVar29 + -4];
                    fVar172 = local_1118[lVar29];
                    fVar193 = local_1108[lVar29];
                    *(float *)(ray + k * 4 + 0x80) = local_1138[lVar29];
                    *(float *)(ray + k * 4 + 0xc0) = fVar161;
                    *(float *)(ray + k * 4 + 0xd0) = fVar172;
                    *(float *)(ray + k * 4 + 0xe0) = fVar193;
                    *(float *)(ray + k * 4 + 0xf0) = fVar147;
                    *(float *)(ray + k * 4 + 0x100) = fVar164;
                    *(float *)(ray + k * 4 + 0x110) = fVar137;
                    *(uint *)(ray + k * 4 + 0x120) = uVar24;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    root.ptr = (size_t)ray;
                  }
                  else {
                    local_12c8 = CONCAT44(uVar24,uVar24);
                    local_11f8 = (GridSOA *)CONCAT44(fVar137,fVar137);
                    auVar10 = *(undefined1 (*) [12])
                               *(undefined1 (*) [16])(mm_lookupmask_ps + lVar15);
                    uStack_125c = (undefined4)
                                  ((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar15 + 8) >> 0x20);
                    local_1218 = uVar22;
                    fStack_11f0 = fVar137;
                    fStack_11ec = fVar137;
                    while( true ) {
                      local_1068 = local_1158[lVar29];
                      fVar137 = local_1148[lVar29];
                      *(float *)(ray + k * 4 + 0x80) = local_1138[lVar29];
                      args.context = context->user;
                      local_1058._4_4_ = fVar137;
                      local_1058._0_4_ = fVar137;
                      local_1058._8_4_ = fVar137;
                      local_1058._12_4_ = fVar137;
                      local_1098 = local_1118[lVar29 + -4];
                      fVar137 = local_1118[lVar29];
                      local_1078 = local_1108[lVar29];
                      local_1088._4_4_ = fVar137;
                      local_1088._0_4_ = fVar137;
                      local_1088._8_4_ = fVar137;
                      local_1088._12_4_ = fVar137;
                      fStack_1094 = local_1098;
                      fStack_1090 = local_1098;
                      fStack_108c = local_1098;
                      fStack_1074 = local_1078;
                      fStack_1070 = local_1078;
                      fStack_106c = local_1078;
                      fStack_1064 = local_1068;
                      fStack_1060 = local_1068;
                      fStack_105c = local_1068;
                      local_1048 = local_11f8;
                      uStack_1040 = CONCAT44(fStack_11ec,fStack_11f0);
                      local_1038 = local_12c8;
                      uStack_1030 = CONCAT44(uVar24,uVar24);
                      local_1028 = (args.context)->instID[0];
                      uStack_1024 = local_1028;
                      uStack_1020 = local_1028;
                      uStack_101c = local_1028;
                      local_1018 = (args.context)->instPrimID[0];
                      uStack_1014 = local_1018;
                      uStack_1010 = local_1018;
                      uStack_100c = local_1018;
                      local_1238._12_4_ = uStack_125c;
                      local_1238._0_12_ = auVar10;
                      args.valid = (int *)local_1238;
                      args.geometryUserPtr = pGVar31->userPtr;
                      args.hit = (RTCHitN *)&local_1098;
                      args.N = 4;
                      p_Var19 = pGVar31->intersectionFilterN;
                      root.ptr = (size_t)ray;
                      args.ray = (RTCRayN *)ray;
                      if (p_Var19 != (RTCFilterFunctionN)0x0) {
                        auVar174 = (*p_Var19)(&args);
                        root.ptr = auVar174._8_8_;
                        p_Var19 = auVar174._0_8_;
                      }
                      auVar67._0_4_ = -(uint)(local_1238._0_4_ == 0);
                      auVar67._4_4_ = -(uint)(local_1238._4_4_ == 0);
                      auVar67._8_4_ = -(uint)(local_1238._8_4_ == 0);
                      auVar67._12_4_ = -(uint)(local_1238._12_4_ == 0);
                      uVar34 = movmskps((int)p_Var19,auVar67);
                      pRVar17 = (RTCRayN *)(ulong)(uVar34 ^ 0xf);
                      if ((uVar34 ^ 0xf) == 0) {
                        auVar67 = auVar67 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var19 = context->args->filter;
                        auVar12._8_8_ = root.ptr;
                        auVar12._0_8_ = p_Var19;
                        auVar208._8_8_ = root.ptr;
                        auVar208._0_8_ = p_Var19;
                        if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (auVar208 = auVar12, ((pGVar31->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar208 = (*p_Var19)(&args);
                        }
                        root.ptr = auVar208._8_8_;
                        auVar51._0_4_ = -(uint)(local_1238._0_4_ == 0);
                        auVar51._4_4_ = -(uint)(local_1238._4_4_ == 0);
                        auVar51._8_4_ = -(uint)(local_1238._8_4_ == 0);
                        auVar51._12_4_ = -(uint)(local_1238._12_4_ == 0);
                        auVar67 = auVar51 ^ _DAT_01f7ae20;
                        uVar34 = movmskps(auVar208._0_4_,auVar51);
                        pRVar17 = (RTCRayN *)(ulong)(uVar34 ^ 0xf);
                        if ((uVar34 ^ 0xf) != 0) {
                          auVar92._0_4_ = *(uint *)(args.ray + 0xc0) & auVar51._0_4_;
                          auVar92._4_4_ = *(uint *)(args.ray + 0xc4) & auVar51._4_4_;
                          auVar92._8_4_ = *(uint *)(args.ray + 200) & auVar51._8_4_;
                          auVar92._12_4_ = *(uint *)(args.ray + 0xcc) & auVar51._12_4_;
                          auVar144._0_4_ = ~auVar51._0_4_ & *(uint *)args.hit;
                          auVar144._4_4_ = ~auVar51._4_4_ & *(uint *)(args.hit + 4);
                          auVar144._8_4_ = ~auVar51._8_4_ & *(uint *)(args.hit + 8);
                          auVar144._12_4_ = ~auVar51._12_4_ & *(uint *)(args.hit + 0xc);
                          *(undefined1 (*) [16])(args.ray + 0xc0) = auVar144 | auVar92;
                          uVar34 = *(uint *)(args.hit + 0x14);
                          uVar140 = *(uint *)(args.hit + 0x18);
                          uVar35 = *(uint *)(args.hit + 0x1c);
                          *(uint *)(args.ray + 0xd0) =
                               ~auVar51._0_4_ & *(uint *)(args.hit + 0x10) |
                               *(uint *)(args.ray + 0xd0) & auVar51._0_4_;
                          *(uint *)(args.ray + 0xd4) =
                               ~auVar51._4_4_ & uVar34 | *(uint *)(args.ray + 0xd4) & auVar51._4_4_;
                          *(uint *)(args.ray + 0xd8) =
                               ~auVar51._8_4_ & uVar140 | *(uint *)(args.ray + 0xd8) & auVar51._8_4_
                          ;
                          *(uint *)(args.ray + 0xdc) =
                               ~auVar51._12_4_ & uVar35 |
                               *(uint *)(args.ray + 0xdc) & auVar51._12_4_;
                          uVar34 = *(uint *)(args.hit + 0x24);
                          uVar140 = *(uint *)(args.hit + 0x28);
                          uVar35 = *(uint *)(args.hit + 0x2c);
                          *(uint *)(args.ray + 0xe0) =
                               ~auVar51._0_4_ & *(uint *)(args.hit + 0x20) |
                               *(uint *)(args.ray + 0xe0) & auVar51._0_4_;
                          *(uint *)(args.ray + 0xe4) =
                               ~auVar51._4_4_ & uVar34 | *(uint *)(args.ray + 0xe4) & auVar51._4_4_;
                          *(uint *)(args.ray + 0xe8) =
                               ~auVar51._8_4_ & uVar140 | *(uint *)(args.ray + 0xe8) & auVar51._8_4_
                          ;
                          *(uint *)(args.ray + 0xec) =
                               ~auVar51._12_4_ & uVar35 |
                               *(uint *)(args.ray + 0xec) & auVar51._12_4_;
                          auVar136._0_4_ = *(uint *)(args.ray + 0xf0) & auVar51._0_4_;
                          auVar136._4_4_ = *(uint *)(args.ray + 0xf4) & auVar51._4_4_;
                          auVar136._8_4_ = *(uint *)(args.ray + 0xf8) & auVar51._8_4_;
                          auVar136._12_4_ = *(uint *)(args.ray + 0xfc) & auVar51._12_4_;
                          auVar93._0_4_ = ~auVar51._0_4_ & *(uint *)(args.hit + 0x30);
                          auVar93._4_4_ = ~auVar51._4_4_ & *(uint *)(args.hit + 0x34);
                          auVar93._8_4_ = ~auVar51._8_4_ & *(uint *)(args.hit + 0x38);
                          auVar93._12_4_ = ~auVar51._12_4_ & *(uint *)(args.hit + 0x3c);
                          *(undefined1 (*) [16])(args.ray + 0xf0) = auVar93 | auVar136;
                          uVar34 = *(uint *)(args.hit + 0x44);
                          uVar140 = *(uint *)(args.hit + 0x48);
                          uVar35 = *(uint *)(args.hit + 0x4c);
                          *(uint *)(args.ray + 0x100) =
                               ~auVar51._0_4_ & *(uint *)(args.hit + 0x40) |
                               *(uint *)(args.ray + 0x100) & auVar51._0_4_;
                          *(uint *)(args.ray + 0x104) =
                               ~auVar51._4_4_ & uVar34 | *(uint *)(args.ray + 0x104) & auVar51._4_4_
                          ;
                          *(uint *)(args.ray + 0x108) =
                               ~auVar51._8_4_ & uVar140 |
                               *(uint *)(args.ray + 0x108) & auVar51._8_4_;
                          *(uint *)(args.ray + 0x10c) =
                               ~auVar51._12_4_ & uVar35 |
                               *(uint *)(args.ray + 0x10c) & auVar51._12_4_;
                          uVar34 = *(uint *)(args.hit + 0x54);
                          uVar140 = *(uint *)(args.hit + 0x58);
                          uVar35 = *(uint *)(args.hit + 0x5c);
                          *(uint *)(args.ray + 0x110) =
                               *(uint *)(args.ray + 0x110) & auVar51._0_4_ |
                               ~auVar51._0_4_ & *(uint *)(args.hit + 0x50);
                          *(uint *)(args.ray + 0x114) =
                               *(uint *)(args.ray + 0x114) & auVar51._4_4_ | ~auVar51._4_4_ & uVar34
                          ;
                          *(uint *)(args.ray + 0x118) =
                               *(uint *)(args.ray + 0x118) & auVar51._8_4_ |
                               ~auVar51._8_4_ & uVar140;
                          *(uint *)(args.ray + 0x11c) =
                               *(uint *)(args.ray + 0x11c) & auVar51._12_4_ |
                               ~auVar51._12_4_ & uVar35;
                          uVar34 = *(uint *)(args.hit + 100);
                          uVar140 = *(uint *)(args.hit + 0x68);
                          uVar35 = *(uint *)(args.hit + 0x6c);
                          *(uint *)(args.ray + 0x120) =
                               *(uint *)(args.ray + 0x120) & auVar51._0_4_ |
                               ~auVar51._0_4_ & *(uint *)(args.hit + 0x60);
                          *(uint *)(args.ray + 0x124) =
                               *(uint *)(args.ray + 0x124) & auVar51._4_4_ | ~auVar51._4_4_ & uVar34
                          ;
                          *(uint *)(args.ray + 0x128) =
                               *(uint *)(args.ray + 0x128) & auVar51._8_4_ |
                               ~auVar51._8_4_ & uVar140;
                          *(uint *)(args.ray + 300) =
                               *(uint *)(args.ray + 300) & auVar51._12_4_ | ~auVar51._12_4_ & uVar35
                          ;
                          auVar94._0_4_ = *(uint *)(args.ray + 0x130) & auVar51._0_4_;
                          auVar94._4_4_ = *(uint *)(args.ray + 0x134) & auVar51._4_4_;
                          auVar94._8_4_ = *(uint *)(args.ray + 0x138) & auVar51._8_4_;
                          auVar94._12_4_ = *(uint *)(args.ray + 0x13c) & auVar51._12_4_;
                          auVar110._0_4_ = ~auVar51._0_4_ & *(uint *)(args.hit + 0x70);
                          auVar110._4_4_ = ~auVar51._4_4_ & *(uint *)(args.hit + 0x74);
                          auVar110._8_4_ = ~auVar51._8_4_ & *(uint *)(args.hit + 0x78);
                          auVar110._12_4_ = ~auVar51._12_4_ & *(uint *)(args.hit + 0x7c);
                          *(undefined1 (*) [16])(args.ray + 0x130) = auVar110 | auVar94;
                          *(undefined1 (*) [16])(args.ray + 0x140) =
                               ~auVar51 & *(undefined1 (*) [16])(args.hit + 0x80) |
                               *(undefined1 (*) [16])(args.ray + 0x140) & auVar51;
                          pRVar17 = args.ray;
                        }
                      }
                      auVar68._0_4_ = auVar67._0_4_ << 0x1f;
                      auVar68._4_4_ = auVar67._4_4_ << 0x1f;
                      auVar68._8_4_ = auVar67._8_4_ << 0x1f;
                      auVar68._12_4_ = auVar67._12_4_ << 0x1f;
                      iVar21 = movmskps((int)pRVar17,auVar68);
                      if (iVar21 == 0) {
                        *(float *)(ray + k * 4 + 0x80) = old_t_1;
                      }
                      else {
                        old_t_1 = *(float *)(ray + k * 4 + 0x80);
                        uStack_12b4 = 0;
                        uStack_12b0 = 0;
                        uStack_12ac = 0;
                      }
                      *(undefined4 *)(local_1238 + lVar29 * 4 + -0x10) = 0;
                      valid.field_0.i[0] = -(uint)(fVar172 <= old_t_1) & valid.field_0.i[0];
                      valid.field_0.i[1] = -(uint)(fVar193 <= old_t_1) & valid.field_0.i[1];
                      valid.field_0.i[2] = -(uint)(fVar164 <= old_t_1) & valid.field_0.i[2];
                      valid.field_0.i[3] = -(uint)(fVar161 <= old_t_1) & valid.field_0.i[3];
                      iVar21 = movmskps(uVar14,(undefined1  [16])valid.field_0);
                      if (iVar21 == 0) break;
                      auVar69._0_4_ = valid.field_0.i[0] & (uint)fVar172;
                      auVar69._4_4_ = valid.field_0.i[1] & (uint)fVar193;
                      auVar69._8_4_ = valid.field_0.i[2] & (uint)fVar164;
                      auVar69._12_4_ = valid.field_0.i[3] & (uint)fVar161;
                      auVar95._0_8_ =
                           CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                      auVar95._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                      auVar95._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                      auVar95 = auVar95 | auVar69;
                      auVar111._4_4_ = auVar95._0_4_;
                      auVar111._0_4_ = auVar95._4_4_;
                      auVar111._8_4_ = auVar95._12_4_;
                      auVar111._12_4_ = auVar95._8_4_;
                      auVar174 = minps(auVar111,auVar95);
                      auVar70._0_8_ = auVar174._8_8_;
                      auVar70._8_4_ = auVar174._0_4_;
                      auVar70._12_4_ = auVar174._4_4_;
                      auVar174 = minps(auVar70,auVar174);
                      auVar71._0_8_ =
                           CONCAT44(-(uint)(auVar174._4_4_ == auVar95._4_4_) & valid.field_0.i[1],
                                    -(uint)(auVar174._0_4_ == auVar95._0_4_) & valid.field_0.i[0]);
                      auVar71._8_4_ = -(uint)(auVar174._8_4_ == auVar95._8_4_) & valid.field_0.i[2];
                      auVar71._12_4_ =
                           -(uint)(auVar174._12_4_ == auVar95._12_4_) & valid.field_0.i[3];
                      iVar21 = movmskps(iVar21,auVar71);
                      aVar52 = valid.field_0;
                      if (iVar21 != 0) {
                        aVar52.i[2] = auVar71._8_4_;
                        aVar52._0_8_ = auVar71._0_8_;
                        aVar52.i[3] = auVar71._12_4_;
                      }
                      uVar25 = movmskps(iVar21,(undefined1  [16])aVar52);
                      uVar22 = CONCAT44(uVar20,uVar25);
                      lVar29 = 0;
                      if (uVar22 != 0) {
                        for (; (uVar22 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar175._4_4_ = uVar14;
        auVar175._0_4_ = uVar14;
        auVar175._8_4_ = uVar14;
        auVar175._12_4_ = uVar14;
        auVar174 = local_10f8;
        fVar125 = local_fd8;
        fVar139 = fStack_fd4;
        fVar53 = fStack_fd0;
        fVar161 = fStack_fcc;
        fVar150 = local_10a8;
        fVar96 = fStack_10a4;
        fVar201 = fStack_10a0;
        fVar205 = fStack_109c;
        fVar154 = local_10b8;
        fVar180 = fStack_10b4;
        fVar98 = fStack_10b0;
        fVar206 = fStack_10ac;
        fVar72 = local_fa8;
        fVar74 = fStack_fa4;
        fVar73 = fStack_fa0;
        fVar137 = fStack_f9c;
        fVar75 = local_fe8;
        fVar76 = fStack_fe4;
        fVar97 = fStack_fe0;
        fVar172 = fStack_fdc;
        fVar112 = local_fb8;
        fVar113 = fStack_fb4;
        fVar114 = fStack_fb0;
        fVar147 = fStack_fac;
        fVar120 = local_fc8;
        fVar121 = fStack_fc4;
        fVar122 = fStack_fc0;
        fVar164 = fStack_fbc;
        fVar123 = local_ff8;
        fVar124 = fStack_ff4;
        fVar126 = fStack_ff0;
        fVar193 = fStack_fec;
        fVar127 = local_1008;
        fVar128 = fStack_1004;
        fVar138 = fStack_1000;
        fVar200 = fStack_ffc;
      }
      else {
        root.ptr = (ulong)pGVar26 & 0xfffffffffffffff0;
        sVar7 = *(size_t *)(((GridSOA *)root.ptr)->data + ((GridSOA *)root.ptr)->rootOffset);
        (local_1228->super_Precalculations).grid = (GridSOA *)root.ptr;
        uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar175._4_4_ = uVar14;
        auVar175._0_4_ = uVar14;
        auVar175._8_4_ = uVar14;
        auVar175._12_4_ = uVar14;
        if (sVar7 != 0) {
          (pSVar16->ptr).ptr = sVar7;
          pSVar16->dist = 0;
          pSVar16 = pSVar16 + 1;
        }
      }
    }
    if (pSVar16 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }